

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  stbtt_uint8 sVar10;
  byte bVar11;
  ImWchar IVar12;
  short sVar13;
  int iVar14;
  ImFont *pIVar15;
  ImFont **ppIVar16;
  stbtt_uint8 *data;
  ImFontConfig *pIVar17;
  long lVar18;
  char cVar19;
  char cVar25;
  stbrp_node *psVar33;
  undefined1 auVar34 [16];
  stbtt__buf fontdict;
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  unkuint10 Var37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [16];
  unkbyte10 Var40;
  undefined1 auVar41 [13];
  undefined1 auVar42 [11];
  undefined1 auVar43 [14];
  undefined1 auVar44 [15];
  undefined1 auVar45 [14];
  undefined1 auVar46 [16];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  uint6 uVar52;
  ushort uVar53;
  short sVar54;
  stbtt_uint32 sVar55;
  uint uVar61;
  int iVar62;
  stbtt__active_edge *z;
  stbtt_uint32 sVar56;
  stbtt_uint32 sVar57;
  stbtt_uint32 sVar58;
  stbtt_uint32 sVar59;
  stbtt_uint32 sVar60;
  void *pvVar63;
  ulong uVar64;
  undefined4 extraout_var;
  int *piVar65;
  void *pvVar66;
  stbrp_context *ptr;
  uchar *puVar67;
  stbtt__point *points;
  stbtt__edge *psVar68;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar69;
  stbtt__buf *psVar70;
  undefined8 *puVar71;
  int iVar72;
  long lVar73;
  ImWchar *pIVar74;
  ushort *puVar75;
  uint *puVar76;
  stbtt__active_edge *psVar77;
  stbtt__active_edge *psVar78;
  long lVar79;
  ulong uVar80;
  uint uVar81;
  stbtt_fontinfo *psVar82;
  ImFontAtlas *pIVar83;
  byte *pbVar84;
  ImFontAtlas *atlas_00;
  ImU32 bit_n;
  uchar uVar85;
  int output_i;
  ulong uVar86;
  stbtt__edge *psVar87;
  ulong uVar88;
  size_t size;
  byte *pbVar89;
  ImFontConfig *pIVar90;
  int iVar91;
  int iVar92;
  long lVar93;
  undefined1 auVar94 [8];
  undefined8 *ptr_00;
  int iVar95;
  stbtt__active_edge *psVar96;
  uint uVar97;
  long lVar98;
  ImU32 mask;
  bool bVar99;
  bool bVar100;
  byte bVar101;
  float fVar102;
  byte bVar109;
  char cVar110;
  char cVar111;
  short sVar112;
  ushort uVar113;
  short sVar114;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar115;
  undefined4 uVar123;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar124;
  undefined1 auVar119 [16];
  uint uVar125;
  uint uVar127;
  uint uVar128;
  uint uVar129;
  undefined1 auVar126 [16];
  uint uVar130;
  uint uVar131;
  uint uVar132;
  undefined1 in_XMM3 [16];
  uint uVar133;
  uint uVar134;
  uint uVar136;
  uint uVar137;
  undefined1 auVar135 [16];
  uint uVar138;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar144;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar150;
  undefined4 uVar151;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar156 [16];
  float fVar161;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined4 uVar169;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  stbtt__buf sVar184;
  float y0_2;
  int y1;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb3c;
  int iVar185;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined4 in_stack_fffffffffffffb60;
  uint in_stack_fffffffffffffb64;
  void *pvStack_490;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  ulong local_468;
  long local_460;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined8 local_438;
  void *pvStack_430;
  undefined8 local_428;
  void *pvStack_420;
  stbrp_node *local_418;
  undefined8 local_410;
  int local_404;
  float local_400;
  uint local_3fc;
  void *local_3f8;
  ulong local_3f0;
  undefined1 local_3e8 [16];
  ulong local_3d8;
  float local_3d0;
  int local_3cc;
  ulong local_3c8;
  uchar *local_3c0;
  long local_3b8;
  stbtt__point *local_3b0;
  uchar *local_3a8;
  ulong local_3a0;
  ulong local_398;
  float *local_390;
  uint local_384;
  uint local_380;
  int local_37c;
  int local_378;
  float local_374;
  float local_370;
  int local_36c;
  int local_368;
  int local_364;
  stbrp_context *local_360;
  ulong local_358;
  stbtt_fontinfo *local_350;
  float *local_348;
  ulong local_340;
  ulong local_338;
  stbtt__edge *local_330;
  float local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  float local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  ImFontConfig *local_308;
  long local_300;
  long local_2f8;
  undefined4 *local_2f0;
  long local_2e8;
  long local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  undefined8 *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  ulong local_298;
  undefined8 uStack_290;
  stbtt__buf local_288 [33];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined6 uVar152;
  undefined8 uVar153;
  undefined1 auVar154 [12];
  undefined1 auVar155 [14];
  undefined1 auVar157 [16];
  undefined6 uVar170;
  undefined8 uVar171;
  undefined1 auVar172 [12];
  undefined1 auVar173 [14];
  undefined1 auVar177 [16];
  
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  pvStack_490 = (void *)0x0;
  local_438 = 0;
  pvStack_430 = (void *)0x0;
  iVar14 = (atlas->ConfigData).Size;
  if (0 < iVar14) {
    iVar62 = 8;
    if (7 < iVar14) {
      iVar62 = iVar14;
    }
    if (0 < iVar62) {
      pvStack_490 = ImGui::MemAlloc((long)iVar62 * 0x110);
    }
  }
  uVar61 = (atlas->Fonts).Size;
  if (local_438._4_4_ < (int)uVar61) {
    if (local_438._4_4_ == 0) {
      uVar97 = 8;
    }
    else {
      uVar97 = local_438._4_4_ / 2 + local_438._4_4_;
    }
    if ((int)uVar97 <= (int)uVar61) {
      uVar97 = uVar61;
    }
    if (local_438._4_4_ < (int)uVar97) {
      pvVar63 = ImGui::MemAlloc((long)(int)uVar97 << 5);
      if (pvStack_430 != (void *)0x0) {
        memcpy(pvVar63,pvStack_430,(long)(int)local_438 << 5);
        ImGui::MemFree(pvStack_430);
      }
      local_438 = (ulong)uVar97 << 0x20;
      pvStack_430 = pvVar63;
    }
  }
  local_438 = CONCAT44(local_438._4_4_,uVar61);
  pIVar83 = atlas;
  memset(pvStack_490,0,(long)iVar14 * 0x110);
  memset(pvStack_430,0,(long)(int)local_438 << 5);
  iVar62 = (atlas->ConfigData).Size;
  iVar185 = CONCAT13(iVar62 < 1,(int3)in_stack_fffffffffffffb3c);
  if (0 < iVar62) {
    lVar93 = 0;
    do {
      pIVar90 = (atlas->ConfigData).Data + lVar93;
      lVar73 = lVar93 * 0x110;
      *(undefined4 *)((long)pvStack_490 + lVar73 + 0xe0) = 0xffffffff;
      uVar64 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar64 < 1) goto LAB_001421fb;
      pIVar15 = pIVar90->DstFont;
      ppIVar16 = (atlas->Fonts).Data;
      uVar88 = 0xffffffff;
      uVar86 = 0;
      do {
        if (pIVar15 == ppIVar16[uVar86]) {
          *(int *)((long)pvStack_490 + lVar73 + 0xe0) = (int)uVar86;
          uVar88 = uVar86 & 0xffffffff;
        }
        uVar86 = uVar86 + 1;
      } while ((uVar86 < uVar64) && ((int)uVar88 == -1));
      if ((int)uVar88 == -1) goto LAB_001421fb;
      local_458._0_8_ = lVar93;
      data = (stbtt_uint8 *)pIVar90->FontData;
      iVar62 = pIVar90->FontNo;
      sVar10 = *data;
      local_3e8._0_8_ = pIVar90;
      if (((((sVar10 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar10 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_0013f137:
        uVar61 = -(uint)(iVar62 != 0);
LAB_0013f140:
        local_4b8._0_4_ = uVar61;
      }
      else {
        if (sVar10 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_0013f10d;
          goto LAB_0013f137;
        }
        if ((((sVar10 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_0013f137;
LAB_0013f10d:
        local_4b8._0_4_ = 0xffffffff;
        if (sVar10 == 't') {
          if (data[1] != 't') {
            if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_0013f137;
            goto LAB_0013f182;
          }
          if ((data[2] != 'c') || (data[3] != 'f')) goto LAB_0013f182;
          uVar61 = *(uint *)(data + 4);
          uVar61 = uVar61 >> 0x18 | (uVar61 & 0xff0000) >> 8 | (uVar61 & 0xff00) << 8 |
                   uVar61 << 0x18;
          if (((uVar61 != 0x20000) && (uVar61 != 0x10000)) ||
             (uVar61 = *(uint *)(data + 8),
             (int)(uVar61 >> 0x18 | (uVar61 & 0xff0000) >> 8 | (uVar61 & 0xff00) << 8 |
                  uVar61 << 0x18) <= iVar62)) goto LAB_0013f182;
          uVar61 = *(uint *)(data + (long)iVar62 * 4 + 0xc);
          uVar61 = uVar61 >> 0x18 | (uVar61 & 0xff0000) >> 8 | (uVar61 & 0xff00) << 8 |
                   uVar61 << 0x18;
          goto LAB_0013f140;
        }
      }
LAB_0013f182:
      *(stbtt_uint8 **)((long)pvStack_490 + lVar73 + 8) = data;
      *(undefined4 *)((long)pvStack_490 + lVar73 + 0x10) = local_4b8._0_4_;
      *(undefined8 *)((long)pvStack_490 + lVar73 + 0x40) = 0;
      *(undefined8 *)((long)pvStack_490 + lVar73 + 0x48) = 0;
      sVar55 = stbtt__find_table(data,local_4b8._0_4_,"cmap");
      auVar116 = local_478;
      local_478._4_4_ = extraout_var;
      local_478._0_4_ = sVar55;
      local_478._8_8_ = auVar116._8_8_;
      sVar55 = stbtt__find_table(data,local_4b8._0_4_,"loca");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar73 + 0x18) = sVar55;
      sVar56 = stbtt__find_table(data,local_4b8._0_4_,"head");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar73 + 0x1c) = sVar56;
      sVar57 = stbtt__find_table(data,local_4b8._0_4_,"glyf");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar73 + 0x20) = sVar57;
      sVar58 = stbtt__find_table(data,local_4b8._0_4_,"hhea");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar73 + 0x24) = sVar58;
      sVar59 = stbtt__find_table(data,local_4b8._0_4_,"hmtx");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar73 + 0x28) = sVar59;
      sVar60 = stbtt__find_table(data,local_4b8._0_4_,"kern");
      auVar116 = local_478;
      *(stbtt_uint32 *)((long)pvStack_490 + lVar73 + 0x2c) = sVar60;
      uVar153 = local_478._0_8_;
      sVar60 = stbtt__find_table(data,local_4b8._0_4_,"GPOS");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar73 + 0x30) = sVar60;
      iVar62 = auVar116._0_4_;
      if ((((iVar62 == 0) || (sVar56 == 0)) || (sVar58 == 0)) || (sVar59 == 0)) goto LAB_001421fb;
      if (sVar57 == 0) {
        local_428 = CONCAT44(local_428._4_4_,2);
        local_488._0_8_ = local_488._0_8_ & 0xffffffff00000000;
        local_410._0_4_ = 0;
        uVar61 = 0;
        sVar57 = stbtt__find_table(data,local_4b8._0_4_,"CFF ");
        if (sVar57 == 0) goto LAB_001421fb;
        *(undefined8 *)((long)pvStack_490 + lVar73 + 0x90) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar73 + 0x98) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar73 + 0x80) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar73 + 0x88) = 0;
        *(stbtt_uint8 **)((long)pvStack_490 + lVar73 + 0x40) = data + sVar57;
        *(undefined8 *)((long)pvStack_490 + lVar73 + 0x48) = 0x2000000000000000;
        local_288[0].data = *(uchar **)((long)pvStack_490 + lVar73 + 0x40);
        uVar171 = *(undefined8 *)((long)pvStack_490 + lVar73 + 0x48);
        local_288[0].cursor = (int)uVar171;
        local_288[0].size = (int)((ulong)uVar171 >> 0x20);
        uVar97 = local_288[0].cursor + 2U;
        if (local_288[0].size < (int)(local_288[0].cursor + 2U)) {
          uVar97 = local_288[0].size;
        }
        if (local_288[0].cursor < -2) {
          uVar97 = local_288[0].size;
        }
        local_288[0].cursor = 0;
        if ((int)uVar97 < local_288[0].size) {
          local_288[0].cursor = (int)local_288[0].data[(int)uVar97];
        }
        if (local_288[0].size < local_288[0].cursor) {
          local_288[0].cursor = local_288[0].size;
        }
        stbtt__cff_get_index(local_288);
        sVar184 = stbtt__cff_get_index(local_288);
        local_448 = (undefined1  [16])stbtt__cff_index_get(sVar184,0);
        stbtt__cff_get_index(local_288);
        sVar184 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)pvStack_490 + lVar73 + 0x60) = sVar184;
        stbtt__dict_get_ints((stbtt__buf *)local_448,0x11,1,(stbtt_uint32 *)local_488);
        stbtt__dict_get_ints((stbtt__buf *)local_448,0x106,1,(stbtt_uint32 *)&local_428);
        stbtt__dict_get_ints((stbtt__buf *)local_448,0x124,1,(stbtt_uint32 *)&local_410);
        stbtt__dict_get_ints
                  ((stbtt__buf *)local_448,0x125,1,(stbtt_uint32 *)&stack0xfffffffffffffb64);
        sVar184.data._4_4_ = sVar55;
        sVar184.data._0_4_ = in_stack_fffffffffffffb30;
        sVar184.cursor = sVar56;
        sVar184.size = iVar185;
        fontdict.cursor = in_stack_fffffffffffffb60;
        fontdict.data = &pIVar83->Locked;
        fontdict.size = uVar61;
        sVar184 = stbtt__get_subrs(sVar184,fontdict);
        *(stbtt__buf *)((long)pvStack_490 + lVar73 + 0x70) = sVar184;
        if (((stbtt_uint32)local_428 != 2) || (uVar151 = local_488._0_4_, local_488._0_4_ == 0))
        goto LAB_001421fb;
        in_stack_fffffffffffffb64 = uVar61;
        if ((stbtt_uint32)local_410 != 0) {
          if ((ulong)uVar61 == 0) goto LAB_001421fb;
          local_288[0].cursor = (stbtt_uint32)local_410;
          if (local_288[0].size < (int)(stbtt_uint32)local_410) {
            local_288[0].cursor = local_288[0].size;
          }
          if ((int)(stbtt_uint32)local_410 < 0) {
            local_288[0].cursor = local_288[0].size;
          }
          sVar184 = stbtt__cff_get_index(local_288);
          *(stbtt__buf *)((long)pvStack_490 + lVar73 + 0x80) = sVar184;
          puVar67 = local_288[0].data + uVar61;
          lVar93 = (ulong)(local_288[0].size - uVar61) << 0x20;
          if ((int)(local_288[0].size - uVar61 | uVar61) < 0 || local_288[0].size < (int)uVar61) {
            puVar67 = (uchar *)0x0;
            lVar93 = 0;
          }
          *(uchar **)((long)pvStack_490 + lVar73 + 0x90) = puVar67;
          *(long *)((long)pvStack_490 + lVar73 + 0x98) = lVar93;
        }
        local_288[0].cursor = uVar151;
        if (local_288[0].size < (int)uVar151) {
          local_288[0].cursor = local_288[0].size;
        }
        if ((int)uVar151 < 0) {
          local_288[0].cursor = local_288[0].size;
        }
        sVar184 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)pvStack_490 + lVar73 + 0x50) = sVar184;
        atlas = pIVar83;
      }
      else {
        atlas = pIVar83;
        if (sVar55 == 0) goto LAB_001421fb;
      }
      sVar55 = stbtt__find_table(data,local_4b8._0_4_,"maxp");
      if (sVar55 == 0) {
        uVar61 = 0xffff;
      }
      else {
        uVar61 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar55 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar55 + 4) >> 8);
      }
      *(uint *)((long)pvStack_490 + lVar73 + 0x14) = uVar61;
      uVar53 = *(ushort *)(data + (uVar153 & 0xffffffff) + 2) << 8 |
               *(ushort *)(data + (uVar153 & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)pvStack_490 + lVar73 + 0x34) = 0;
      if (uVar53 != 0) {
        uVar61 = iVar62 + 4;
        uVar64 = (ulong)uVar53;
        do {
          uVar53 = *(ushort *)(data + uVar61) << 8 | *(ushort *)(data + uVar61) >> 8;
          if ((uVar53 == 0) ||
             ((uVar53 == 3 &&
              ((uVar53 = *(ushort *)(data + (ulong)uVar61 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar61 + 2) >> 8, uVar53 == 10 || (uVar53 == 1)))
              ))) {
            uVar97 = *(uint *)(data + (ulong)uVar61 + 4);
            *(uint *)((long)pvStack_490 + lVar73 + 0x34) =
                 (uVar97 >> 0x18 | (uVar97 & 0xff0000) >> 8 | (uVar97 & 0xff00) << 8 |
                 uVar97 << 0x18) + iVar62;
          }
          uVar61 = uVar61 + 8;
          uVar64 = uVar64 - 1;
        } while (uVar64 != 0);
      }
      if (*(int *)((long)pvStack_490 + lVar73 + 0x34) == 0) goto LAB_001421fb;
      *(uint *)((long)pvStack_490 + lVar73 + 0x38) =
           (uint)(ushort)(*(ushort *)(data + (long)(int)sVar56 + 0x32) << 8 |
                         *(ushort *)(data + (long)(int)sVar56 + 0x32) >> 8);
      piVar65 = (int *)((long)*(int *)((long)pvStack_490 + lVar73 + 0xe0) * 0x20 + (long)pvStack_430
                       );
      pIVar74 = *(ImWchar **)(local_3e8._0_8_ + 0x38);
      if (pIVar74 == (ImWchar *)0x0) {
        pIVar74 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvStack_490 + lVar73 + 0xd8) = pIVar74;
      IVar12 = *pIVar74;
      while (IVar12 != 0) {
        uVar53 = pIVar74[1];
        if (uVar53 == 0) break;
        uVar61 = *(uint *)((long)pvStack_490 + lVar73 + 0xe4);
        uVar97 = (uint)uVar53;
        if ((int)(uint)uVar53 < (int)uVar61) {
          uVar97 = uVar61;
        }
        *(uint *)((long)pvStack_490 + lVar73 + 0xe4) = uVar97;
        IVar12 = pIVar74[2];
        pIVar74 = pIVar74 + 2;
      }
      *piVar65 = *piVar65 + 1;
      iVar62 = *(int *)((long)pvStack_490 + lVar73 + 0xe4);
      if (iVar62 < piVar65[1]) {
        iVar62 = piVar65[1];
      }
      piVar65[1] = iVar62;
      lVar93 = local_458._0_8_ + 1;
      lVar73 = (long)(atlas->ConfigData).Size;
      iVar185 = CONCAT13(lVar73 <= lVar93,(int3)iVar185);
      pIVar83 = atlas;
    } while (lVar93 < lVar73);
  }
  auVar94 = (undefined1  [8])0x0;
  if (0 < iVar14) {
    lVar93 = 0;
    auVar94 = (undefined1  [8])0x0;
    do {
      lVar73 = lVar93 * 0x110;
      pvVar63 = (void *)((long)*(int *)((long)pvStack_490 + lVar73 + 0xe0) * 0x20 +
                        (long)pvStack_430);
      ImBitVector::Create((ImBitVector *)((long)pvStack_490 + lVar73 + 0xf0),
                          *(int *)((long)pvStack_490 + lVar73 + 0xe4) + 1);
      if (*(int *)((long)pvVar63 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar63 + 0x10),*(int *)((long)pvVar63 + 4) + 1);
      }
      local_458._0_8_ = lVar93;
      psVar82 = (stbtt_fontinfo *)((long)pvStack_490 + lVar73);
      puVar75 = *(ushort **)&psVar82[1].indexToLocFormat;
      uVar53 = *puVar75;
      if (uVar53 != 0) {
        local_478._0_8_ = pvVar63;
        do {
          uVar113 = puVar75[1];
          if (uVar113 == 0) break;
          local_4b8 = auVar94;
          if (uVar53 <= uVar113) {
            uVar61 = (uint)uVar53;
            lVar93 = *(long *)(local_478._0_8_ + 0x18);
            do {
              auVar116 = _local_4b8;
              uVar97 = 1 << ((byte)uVar61 & 0x1f);
              if (((*(uint *)(lVar93 + (ulong)(uVar61 >> 5) * 4) >> (uVar61 & 0x1f) & 1) == 0) &&
                 (iVar62 = stbtt_FindGlyphIndex(psVar82,uVar61), iVar62 != 0)) {
                piVar65 = &psVar82[1].cff.cursor;
                *piVar65 = *piVar65 + 1;
                *(int *)(local_478._0_8_ + 8) = *(int *)(local_478._0_8_ + 8) + 1;
                uVar64 = (ulong)((uVar61 >> 5) << 2);
                puVar1 = (uint *)(*(long *)&psVar82[1].charstrings.cursor + uVar64);
                *puVar1 = *puVar1 | uVar97;
                puVar1 = (uint *)(lVar93 + uVar64);
                *puVar1 = *puVar1 | uVar97;
                iVar62 = local_4b8._0_4_;
                local_4b8._4_4_ = 0;
                local_4b8._0_4_ = iVar62 + 1;
                _fStack_4b0 = auVar116._8_8_;
              }
              uVar61 = uVar61 + 1;
            } while (uVar113 + 1 != uVar61);
          }
          uVar53 = puVar75[2];
          puVar75 = puVar75 + 2;
          auVar94 = local_4b8;
        } while (uVar53 != 0);
      }
      lVar93 = local_458._0_8_ + 1;
    } while (lVar93 < iVar14);
  }
  local_4b8 = auVar94;
  if (0 < iVar14) {
    lVar93 = 0;
    do {
      lVar73 = lVar93 * 0x110;
      iVar62 = *(int *)((long)pvStack_490 + lVar73 + 0xe8);
      if (*(int *)((long)pvStack_490 + lVar73 + 0x104) < iVar62) {
        pvVar66 = ImGui::MemAlloc((long)iVar62 << 2);
        pvVar63 = *(void **)((long)pvStack_490 + lVar73 + 0x108);
        if (pvVar63 != (void *)0x0) {
          memcpy(pvVar66,pvVar63,(long)*(int *)((long)pvStack_490 + lVar73 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvStack_490 + lVar73 + 0x108));
        }
        *(void **)((long)pvStack_490 + lVar73 + 0x108) = pvVar66;
        *(int *)((long)pvStack_490 + lVar73 + 0x104) = iVar62;
      }
      local_458._0_8_ = lVar93;
      lVar93 = (long)*(int *)((long)pvStack_490 + lVar73 + 0xf0);
      if (0 < lVar93) {
        puVar76 = *(uint **)((long)pvStack_490 + lVar73 + 0xf8);
        puVar1 = puVar76 + lVar93;
        iVar62 = 0;
        do {
          local_478._0_8_ = puVar76;
          uVar61 = *puVar76;
          if (uVar61 != 0) {
            uVar97 = 0;
            do {
              if ((uVar61 >> (uVar97 & 0x1f) & 1) != 0) {
                iVar95 = *(int *)((long)pvStack_490 + lVar73 + 0x100);
                iVar92 = *(int *)((long)pvStack_490 + lVar73 + 0x104);
                if (iVar95 == iVar92) {
                  if (iVar92 == 0) {
                    iVar72 = 8;
                  }
                  else {
                    iVar72 = iVar92 / 2 + iVar92;
                  }
                  iVar95 = iVar95 + 1;
                  if (iVar95 < iVar72) {
                    iVar95 = iVar72;
                  }
                  if (iVar92 < iVar95) {
                    pvVar66 = ImGui::MemAlloc((long)iVar95 << 2);
                    pvVar63 = *(void **)((long)pvStack_490 + lVar73 + 0x108);
                    if (pvVar63 != (void *)0x0) {
                      memcpy(pvVar66,pvVar63,(long)*(int *)((long)pvStack_490 + lVar73 + 0x100) << 2
                            );
                      ImGui::MemFree(*(void **)((long)pvStack_490 + lVar73 + 0x108));
                    }
                    *(void **)((long)pvStack_490 + lVar73 + 0x108) = pvVar66;
                    *(int *)((long)pvStack_490 + lVar73 + 0x104) = iVar95;
                  }
                }
                *(uint *)(*(long *)((long)pvStack_490 + lVar73 + 0x108) +
                         (long)*(int *)((long)pvStack_490 + lVar73 + 0x100) * 4) = iVar62 + uVar97;
                piVar65 = (int *)((long)pvStack_490 + lVar73 + 0x100);
                *piVar65 = *piVar65 + 1;
              }
              uVar97 = uVar97 + 1;
            } while (uVar97 != 0x20);
          }
          puVar76 = (uint *)(local_478._0_8_ + 4);
          iVar62 = iVar62 + 0x20;
        } while (puVar76 < puVar1);
      }
      pvVar63 = *(void **)((long)pvStack_490 + lVar73 + 0xf8);
      uVar153 = local_458._0_8_;
      if (pvVar63 != (void *)0x0) {
        *(undefined8 *)((long)pvStack_490 + lVar73 + 0xf0) = 0;
        ImGui::MemFree(pvVar63);
        *(undefined8 *)((long)pvStack_490 + lVar73 + 0xf8) = 0;
      }
      lVar93 = uVar153 + 1;
    } while (lVar93 < iVar14);
  }
  uVar61 = SUB84(auVar94,0);
  if (0 < (int)local_438) {
    lVar93 = 0x18;
    lVar73 = 0;
    do {
      pvVar63 = pvStack_430;
      if (*(void **)((long)pvStack_430 + lVar93) != (void *)0x0) {
        *(undefined8 *)((long)pvStack_430 + lVar93 + -8) = 0;
        ImGui::MemFree(*(void **)((long)pvStack_430 + lVar93));
        *(undefined8 *)((long)pvVar63 + lVar93) = 0;
      }
      lVar73 = lVar73 + 1;
      lVar93 = lVar93 + 0x20;
    } while (lVar73 < (int)local_438);
  }
  if (pvStack_430 != (void *)0x0) {
    local_438 = 0;
    ImGui::MemFree(pvStack_430);
    pvStack_430 = (void *)0x0;
  }
  local_448 = ZEXT816(0);
  local_428 = 0;
  pvStack_420 = (void *)0x0;
  if (0 < (int)uVar61) {
    uVar97 = 8;
    if (7 < (int)uVar61) {
      uVar97 = uVar61;
    }
    if (0 < (int)uVar97) {
      pvVar63 = ImGui::MemAlloc((long)(int)uVar97 << 4);
      if ((void *)local_448._8_8_ != (void *)0x0) {
        memcpy(pvVar63,(void *)local_448._8_8_,(long)(int)local_448._0_4_ << 4);
        ImGui::MemFree((void *)local_448._8_8_);
      }
      auVar116._4_8_ = pvVar63;
      auVar116._0_4_ = uVar97;
      auVar116._12_4_ = 0;
      local_448 = auVar116 << 0x20;
    }
  }
  local_448._0_4_ = uVar61;
  if (local_428._4_4_ < (int)uVar61) {
    if (local_428._4_4_ == 0) {
      uVar97 = 8;
    }
    else {
      uVar97 = local_428._4_4_ / 2 + local_428._4_4_;
    }
    if ((int)uVar97 <= (int)uVar61) {
      uVar97 = uVar61;
    }
    if (local_428._4_4_ < (int)uVar97) {
      pvVar63 = ImGui::MemAlloc((long)(int)uVar97 * 0x1c);
      if (pvStack_420 != (void *)0x0) {
        memcpy(pvVar63,pvStack_420,(long)(int)(stbtt_uint32)local_428 * 0x1c);
        ImGui::MemFree(pvStack_420);
      }
      local_428 = (ulong)uVar97 << 0x20;
      pvStack_420 = pvVar63;
    }
  }
  local_428 = CONCAT44(local_428._4_4_,uVar61);
  iVar62 = 0;
  atlas_00 = pIVar83;
  memset((void *)local_448._8_8_,0,(long)(int)local_448._0_4_ << 4);
  memset(pvStack_420,0,(long)(int)(stbtt_uint32)local_428 * 0x1c);
  fVar115 = 0.0;
  if (0 < iVar14) {
    lVar93 = 0;
    iVar92 = 0;
    iVar95 = 0;
    do {
      iVar72 = *(int *)((long)pvStack_490 + lVar93 * 0x110 + 0xe8);
      if (iVar72 != 0) {
        psVar82 = (stbtt_fontinfo *)((long)pvStack_490 + lVar93 * 0x110);
        *(long *)&psVar82[1].hmtx = (long)iVar92 * 0x10 + local_448._8_8_;
        pvVar63 = (void *)((long)iVar95 * 0x1c + (long)pvStack_420);
        *(void **)&psVar82[1].gpos = pvVar63;
        pIVar90 = (pIVar83->ConfigData).Data;
        fVar115 = pIVar90[lVar93].SizePixels;
        uVar151 = 0;
        uVar169 = 0;
        uVar123 = 0;
        *(float *)&psVar82[1].userdata = fVar115;
        *(undefined4 *)((long)&psVar82[1].userdata + 4) = 0;
        psVar82[1].data = *(uchar **)&psVar82[1].gsubrs.cursor;
        psVar82[1].fontstart = *(int *)&psVar82[1].gsubrs.data;
        *(void **)&psVar82[1].loca = pvVar63;
        *(char *)&psVar82[1].glyf = (char)pIVar90[lVar93].OversampleH;
        *(char *)((long)&psVar82[1].glyf + 1) = (char)pIVar90[lVar93].OversampleV;
        if (fVar115 <= 0.0) {
          uVar151 = 0x80000000;
          uVar169 = 0x80000000;
          uVar123 = 0x80000000;
          fVar115 = -fVar115;
          uVar61 = (uint)(ushort)(*(ushort *)(psVar82->data + (long)psVar82->head + 0x12) << 8 |
                                 *(ushort *)(psVar82->data + (long)psVar82->head + 0x12) >> 8);
        }
        else {
          puVar67 = psVar82->data;
          lVar73 = (long)psVar82->hhea;
          uVar61 = ((int)(short)((ushort)puVar67[lVar73 + 4] << 8) | (uint)puVar67[lVar73 + 5]) -
                   ((int)(short)((ushort)puVar67[lVar73 + 6] << 8) | (uint)puVar67[lVar73 + 7]);
          pIVar83 = atlas_00;
        }
        fVar115 = fVar115 / (float)(int)uVar61;
        iVar92 = iVar92 + iVar72;
        iVar95 = iVar95 + iVar72;
        if (0 < *(int *)&psVar82[1].gsubrs.data) {
          local_458._0_4_ = iVar95;
          local_478._0_8_ = lVar93;
          iVar95 = pIVar83->TexGlyphPadding;
          lVar98 = 6;
          lVar73 = 0;
          local_4b8._4_4_ = uVar151;
          local_4b8._0_4_ = fVar115;
          fStack_4b0 = (float)uVar169;
          fStack_4ac = (float)uVar123;
          pIVar83 = atlas_00;
          do {
            iVar72 = stbtt_FindGlyphIndex
                               (psVar82,*(int *)(*(long *)&psVar82[1].gsubrs.cursor + lVar73 * 4));
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar82,iVar72,(float)pIVar90[lVar93].OversampleH * fVar115,
                       (float)pIVar90[lVar93].OversampleV * fVar115,fVar115,in_XMM3._0_4_,
                       (int *)local_288,(int *)local_488,(int *)&local_410,
                       (int *)&stack0xfffffffffffffb64);
            uVar61 = (pIVar90[lVar93].OversampleH +
                     (((stbtt_uint32)local_410 + iVar95) - (int)local_288[0].data)) - 1;
            lVar79 = *(long *)&psVar82[1].hmtx;
            *(short *)(lVar79 + -2 + lVar98) = (short)uVar61;
            uVar97 = (pIVar90[lVar93].OversampleV +
                     ((in_stack_fffffffffffffb64 + iVar95) - local_488._0_4_)) - 1;
            *(short *)(lVar79 + lVar98) = (short)uVar97;
            iVar62 = iVar62 + (uVar97 & 0xffff) * (uVar61 & 0xffff);
            lVar73 = lVar73 + 1;
            lVar98 = lVar98 + 0x10;
          } while (lVar73 < *(int *)&psVar82[1].gsubrs.data);
          lVar93 = local_478._0_8_;
          iVar95 = local_458._0_4_;
          atlas_00 = pIVar83;
        }
      }
      lVar93 = lVar93 + 1;
    } while (lVar93 < iVar14);
    fVar115 = (float)iVar62;
  }
  if (fVar115 < 0.0) {
    fVar115 = sqrtf(fVar115);
  }
  else {
    fVar115 = SQRT(fVar115);
  }
  pIVar83->TexHeight = 0;
  iVar62 = pIVar83->TexDesiredWidth;
  if (iVar62 < 1) {
    iVar95 = (int)fVar115;
    iVar62 = 0x1000;
    if ((iVar95 < 0xb33) && (iVar62 = 0x800, iVar95 < 0x599)) {
      iVar62 = (uint)(0x2cb < iVar95) * 0x200 + 0x200;
    }
  }
  pIVar83->TexWidth = iVar62;
  local_488._12_4_ = pIVar83->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar95 = iVar62 - local_488._12_4_;
  local_418 = (stbrp_node *)ImGui::MemAlloc((long)iVar95 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_418 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_418 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_418);
    }
    local_418 = (stbrp_node *)0x0;
    local_488._12_4_ = 0.0;
    iVar62 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (iVar95 < 2) {
      uVar64 = 0;
    }
    else {
      uVar64 = 0;
      psVar33 = local_418;
      do {
        uVar64 = uVar64 + 1;
        psVar33->next = psVar33 + 1;
        psVar33 = psVar33 + 1;
      } while (iVar95 - 1 != uVar64);
      uVar64 = uVar64 & 0xffffffff;
    }
    local_418[uVar64].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_418;
    ptr->active_head = ptr->extra;
    ptr->width = iVar95;
    ptr->height = 0x8000 - local_488._12_4_;
    ptr->num_nodes = iVar95;
    ptr->align = (iVar95 * 2 + -1) / iVar95;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar95;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_360 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr);
  if (0 < iVar14) {
    lVar93 = 0;
    do {
      lVar73 = lVar93 * 0x110;
      iVar95 = *(int *)((long)pvStack_490 + lVar73 + 0xe8);
      if (iVar95 != 0) {
        stbrp_pack_rects(local_360,*(stbrp_rect **)((long)pvStack_490 + lVar73 + 200),iVar95);
        lVar98 = (long)*(int *)((long)pvStack_490 + lVar73 + 0xe8);
        if (0 < lVar98) {
          lVar73 = *(long *)((long)pvStack_490 + lVar73 + 200);
          lVar79 = 0;
          do {
            if (*(int *)(lVar73 + 0xc + lVar79) != 0) {
              iVar95 = (uint)*(ushort *)(lVar73 + 6 + lVar79) +
                       (uint)*(ushort *)(lVar73 + 10 + lVar79);
              if (iVar95 < atlas_00->TexHeight) {
                iVar95 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = iVar95;
            }
            lVar79 = lVar79 + 0x10;
          } while (lVar98 * 0x10 != lVar79);
        }
      }
      lVar93 = lVar93 + 1;
    } while (lVar93 < iVar14);
  }
  uVar61 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar61 = (int)(uVar61 - 1) >> 1 | uVar61 - 1;
    uVar61 = (int)uVar61 >> 2 | uVar61;
    uVar61 = (int)uVar61 >> 4 | uVar61;
    uVar61 = (int)uVar61 >> 8 | uVar61;
    uVar61 = (int)uVar61 >> 0x10 | uVar61;
  }
  iVar95 = uVar61 + 1;
  atlas_00->TexHeight = iVar95;
  auVar118._0_4_ = (float)atlas_00->TexWidth;
  auVar118._4_4_ = (float)iVar95;
  auVar118._8_8_ = 0;
  auVar116 = divps(_DAT_00181310,auVar118);
  atlas_00->TexUvScale = auVar116._0_8_;
  puVar67 = (uchar *)ImGui::MemAlloc((long)(iVar95 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar67;
  pIVar83 = atlas_00;
  memset(puVar67,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if (0 < iVar14) {
    local_3c0 = atlas_00->TexPixelsAlpha8;
    local_460 = (long)iVar62;
    local_68 = pshuflw(ZEXT416((uint)local_488._12_4_),ZEXT416((uint)local_488._12_4_),0);
    local_37c = iVar62;
    lVar93 = 0;
    auVar118 = _DAT_001811f0;
    auVar116 = _DAT_0018df70;
    do {
      if (*(int *)((long)pvStack_490 + lVar93 * 0x110 + 0xe8) != 0) {
        psVar82 = (stbtt_fontinfo *)((long)pvStack_490 + lVar93 * 0x110);
        local_328 = *(float *)&psVar82[1].userdata;
        local_300 = lVar93;
        if (local_328 <= 0.0) {
          local_328 = (float)((uint)local_328 ^ auVar118._0_4_);
          uStack_324 = auVar118._4_4_;
          uStack_320 = auVar118._8_4_;
          uStack_31c = auVar118._12_4_;
          uVar61 = (uint)(ushort)(*(ushort *)(psVar82->data + (long)psVar82->head + 0x12) << 8 |
                                 *(ushort *)(psVar82->data + (long)psVar82->head + 0x12) >> 8);
        }
        else {
          puVar67 = psVar82->data;
          lVar93 = (long)psVar82->hhea;
          uVar61 = ((int)(short)((ushort)puVar67[lVar93 + 4] << 8) | (uint)puVar67[lVar93 + 5]) -
                   ((int)(short)((ushort)puVar67[lVar93 + 6] << 8) | (uint)puVar67[lVar93 + 7]);
          uStack_324 = 0;
          uStack_320 = 0;
          uStack_31c = 0;
        }
        local_328 = local_328 / (float)(int)uVar61;
        local_308 = (atlas_00->ConfigData).Data;
        atlas_00 = pIVar83;
        if (0 < psVar82[1].fontstart) {
          lVar93._0_4_ = psVar82[1].hmtx;
          lVar93._4_4_ = psVar82[1].kern;
          local_298._0_4_ = psVar82[1].glyf;
          local_298._4_4_ = psVar82[1].hhea;
          uStack_290 = 0;
          auVar44._8_6_ = 0;
          auVar44._0_8_ = local_298;
          auVar44[0xe] = (char)((uint)local_298._4_4_ >> 0x18);
          auVar47._8_4_ = 0;
          auVar47._0_8_ = local_298;
          auVar47[0xc] = (char)((uint)local_298._4_4_ >> 0x10);
          auVar47._13_2_ = auVar44._13_2_;
          auVar48._8_4_ = 0;
          auVar48._0_8_ = local_298;
          auVar48._12_3_ = auVar47._12_3_;
          auVar49._8_2_ = 0;
          auVar49._0_8_ = local_298;
          auVar49[10] = (char)((uint)local_298._4_4_ >> 8);
          auVar49._11_4_ = auVar48._11_4_;
          auVar50._8_2_ = 0;
          auVar50._0_8_ = local_298;
          auVar50._10_5_ = auVar49._10_5_;
          auVar51[8] = (char)local_298._4_4_;
          auVar51._0_8_ = local_298;
          auVar51._9_6_ = auVar50._9_6_;
          cVar111 = (char)((uint)(undefined4)local_298 >> 0x18);
          Var37 = CONCAT91((unkuint9)auVar51._8_7_ << 8,cVar111);
          auVar42[10] = 0;
          auVar42._0_10_ = Var37;
          cVar110 = (char)((uint)(undefined4)local_298 >> 0x10);
          auVar36._1_11_ = auVar42 << 8;
          auVar36[0] = cVar110;
          auVar41[0xc] = 0;
          auVar41._0_12_ = auVar36;
          bVar109 = (byte)((uint)(undefined4)local_298 >> 8);
          auVar35._1_13_ = auVar41 << 8;
          auVar35[0] = bVar109;
          bVar101 = (byte)(undefined4)local_298;
          auVar164._0_2_ = CONCAT11(0,bVar101);
          auVar164._2_14_ = auVar35;
          uVar53 = auVar35._0_2_;
          sVar13 = -auVar36._0_2_;
          uVar113 = (ushort)Var37;
          sVar54 = -uVar113;
          local_3d8 = (ulong)uVar53;
          auVar45._10_2_ = 0;
          auVar45._0_10_ = auVar164._0_10_;
          auVar45._12_2_ = uVar113;
          uVar52 = CONCAT42(auVar45._10_4_,auVar36._0_2_);
          auVar103._4_2_ = uVar53;
          auVar103._0_4_ = auVar164._0_4_;
          auVar103._6_10_ = (unkuint10)uVar52 << 0x10;
          auVar104._0_4_ = (float)auVar164._0_2_;
          auVar104._4_4_ = (float)auVar103._4_4_;
          auVar104._8_4_ = (float)(int)uVar52;
          auVar104._12_4_ = (float)uVar113;
          local_58 = divps(_DAT_00181310,auVar104);
          auVar135[0] = -(bVar101 == 0);
          auVar135[1] = -(bVar101 == 0);
          auVar135[2] = -(bVar101 == 0);
          auVar135[3] = -(bVar101 == 0);
          auVar135[4] = -(bVar109 == 0);
          auVar135[5] = -(bVar109 == 0);
          auVar135[6] = -(bVar109 == 0);
          auVar135[7] = -(bVar109 == 0);
          auVar135[8] = -(cVar110 == '\0');
          auVar135[9] = -(cVar110 == '\0');
          auVar135[10] = -(cVar110 == '\0');
          auVar135[0xb] = -(cVar110 == '\0');
          auVar135[0xc] = -(cVar111 == '\0');
          auVar135[0xd] = -(cVar111 == '\0');
          auVar135[0xe] = -(cVar111 == '\0');
          auVar135[0xf] = -(cVar111 == '\0');
          Var40 = CONCAT64(CONCAT42(CONCAT22(sVar54,sVar54),sVar13),CONCAT22(sVar13,sVar54));
          auVar38._4_8_ = (long)((unkuint10)Var40 >> 0x10);
          auVar38._2_2_ = 1 - uVar53;
          auVar38._0_2_ = 1 - uVar53;
          auVar117._0_4_ = (float)(int)(short)(1 - auVar164._0_2_);
          auVar117._4_4_ = (float)(auVar38._0_4_ >> 0x10);
          auVar117._8_4_ = (float)((int)((unkuint10)Var40 >> 0x10) >> 0x10);
          auVar117._12_4_ = (float)(int)sVar54;
          local_2a8 = local_328 * auVar104._0_4_;
          local_2b8 = local_328 * auVar104._4_4_;
          auVar105._0_4_ = auVar104._0_4_ + auVar104._0_4_;
          auVar105._4_4_ = auVar104._4_4_ + auVar104._4_4_;
          auVar105._8_4_ = auVar104._8_4_ + auVar104._8_4_;
          auVar105._12_4_ = auVar104._12_4_ + auVar104._12_4_;
          auVar118 = divps(auVar117,auVar105);
          local_48._0_16_ = ~auVar135 & auVar118;
          fVar115 = local_2b8;
          if (local_2a8 <= local_2b8) {
            fVar115 = local_2a8;
          }
          local_3d0 = (0.35 / fVar115) * (0.35 / fVar115);
          fStack_2b4 = local_2b8;
          fStack_2b0 = local_2b8;
          fStack_2ac = local_2b8;
          fStack_74 = (float)((uint)local_2b8 ^ (uint)DAT_001811f0);
          local_338 = local_298 & 0xff;
          local_340 = (ulong)bVar109;
          local_468 = (ulong)(auVar164._0_4_ & 0xffff);
          fStack_2a4 = local_2b8;
          fStack_2a0 = local_328 * auVar104._8_4_;
          fStack_29c = local_328 * auVar104._12_4_;
          local_78 = local_2a8;
          fStack_70 = local_2a8;
          fStack_6c = fStack_74;
          lVar73 = 0;
          local_2f8 = lVar93;
          local_350 = psVar82;
          auVar118 = _DAT_001811f0;
          uVar61 = in_stack_fffffffffffffb64;
          do {
            fVar115 = 0.0;
            in_stack_fffffffffffffb64 = uVar61;
            if (*(int *)(lVar93 + 0xc + lVar73 * 0x10) != 0) {
              lVar98 = lVar73 * 0x10 + lVar93;
              sVar13 = *(short *)(lVar98 + 4);
              if ((sVar13 != 0) && (sVar54 = *(short *)(lVar98 + 6), sVar54 != 0)) {
                if (psVar82[1].data == (uchar *)0x0) {
                  iVar62 = *(int *)((long)&psVar82[1].userdata + 4) + (int)lVar73;
                }
                else {
                  iVar62 = *(int *)(psVar82[1].data + lVar73 * 4);
                }
                local_2f0 = (undefined4 *)(lVar73 * 0x1c + *(long *)&psVar82[1].loca);
                local_2e8 = lVar73;
                iVar95 = stbtt_FindGlyphIndex(psVar82,iVar62);
                fVar102 = auVar116._0_4_;
                *(uint *)(lVar98 + 8) =
                     CONCAT22((short)((uint)*(undefined4 *)(lVar98 + 8) >> 0x10) + local_68._2_2_,
                              (short)*(undefined4 *)(lVar98 + 8) + local_68._0_2_);
                *(short *)(lVar98 + 4) = sVar13 - (short)local_488._12_4_;
                *(short *)(lVar98 + 6) = sVar54 - (short)local_488._12_4_;
                puVar67 = psVar82->data;
                uVar53 = *(ushort *)(puVar67 + (long)psVar82->hhea + 0x22) << 8 |
                         *(ushort *)(puVar67 + (long)psVar82->hhea + 0x22) >> 8;
                iVar62 = psVar82->hmtx;
                lVar93 = (ulong)uVar53 * 4 + (long)iVar62 + -4;
                lVar73 = (ulong)uVar53 * 4 + (long)iVar62 + -3;
                if (iVar95 < (int)(uint)uVar53) {
                  lVar93 = (long)(iVar95 * 4) + (long)iVar62;
                  lVar73 = (long)(iVar95 * 4) + 1 + (long)iVar62;
                }
                local_380 = (uint)puVar67[lVar93];
                local_384 = (uint)puVar67[lVar73];
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar82,iVar95,local_2a8,local_2b8,fVar115,fVar102,&local_368,&local_36c,
                           &local_2bc,&local_2c0);
                auVar116 = local_458;
                local_458._2_6_ = 0;
                local_458._0_2_ = *(ushort *)(lVar98 + 8);
                local_458._8_8_ = auVar116._8_8_;
                local_3a8 = (uchar *)(ulong)*(ushort *)(lVar98 + 10);
                local_3f0 = (ulong)*(ushort *)(lVar98 + 4);
                local_3c8 = (ulong)*(ushort *)(lVar98 + 6);
                local_3b8 = lVar98;
                uVar97 = stbtt_GetGlyphShape(psVar82,iVar95,(stbtt_vertex **)&local_410);
                uVar81 = ((int)local_3f0 - (int)local_468) + 1;
                local_358 = (ulong)(uint)-(int)local_3d8;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_350,iVar95,local_2a8,local_2b8,fVar115,fVar102,
                           (int *)&stack0xfffffffffffffb64,&local_364,(int *)0x0,(int *)0x0);
                in_stack_fffffffffffffb64 = uVar61;
                local_3fc = uVar81;
                if (uVar81 != 0) {
                  iVar62 = (int)local_358 + (int)local_3c8 + 1;
                  local_3e8._0_4_ = iVar62;
                  if (iVar62 != 0) {
                    lVar93 = CONCAT44(local_410._4_4_,(stbtt_uint32)local_410);
                    local_404 = local_364;
                    local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                    if ((int)uVar97 < 1) {
                      uVar64 = 0;
                    }
                    else {
                      lVar73 = 0;
                      uVar64 = 0;
                      do {
                        uVar64 = (ulong)((int)uVar64 +
                                        (uint)(*(char *)(lVar93 + 0xc + lVar73) == '\x01'));
                        lVar73 = lVar73 + 0xe;
                      } while ((ulong)uVar97 * 0xe != lVar73);
                    }
                    if ((int)uVar64 == 0) {
LAB_001407d2:
                      pvVar63 = (void *)0x0;
LAB_001407d5:
                      points = (stbtt__point *)0x0;
                    }
                    else {
                      pvVar63 = ImGui::MemAlloc((long)(int)uVar64 << 2);
                      if (pvVar63 == (void *)0x0) {
                        uVar64 = 0;
                        goto LAB_001407d5;
                      }
                      uVar81 = 0;
                      auVar94 = (undefined1  [8])0x0;
                      points = (stbtt__point *)0x0;
                      local_3f8 = pvVar63;
                      do {
                        auVar116 = local_478;
                        local_478._4_4_ = 0;
                        local_478._0_4_ = uVar81;
                        uVar86 = local_478._0_8_;
                        local_478 = auVar116;
                        if (uVar81 == 0) {
LAB_001405a1:
                          local_288[0].data =
                               (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                          if ((int)uVar97 < 1) {
                            lVar73 = -1;
                          }
                          else {
                            local_4b8 = auVar94;
                            local_478 = CONCAT88(local_478._8_8_,uVar86);
                            fVar115 = 0.0;
                            fVar102 = 0.0;
                            uVar81 = 0xffffffff;
                            lVar73 = 0;
                            do {
                              puVar67 = local_288[0].data;
                              switch(*(undefined1 *)(lVar93 + 0xc + lVar73)) {
                              case 1:
                                if (-1 < (int)uVar81) {
                                  *(int *)((long)local_3f8 + (ulong)uVar81 * 4) =
                                       (int)local_288[0].data - local_4b8._0_4_;
                                }
                                uVar81 = uVar81 + 1;
                                auVar116 = pshuflw(ZEXT416(*(uint *)(lVar93 + lVar73)),
                                                   ZEXT416(*(uint *)(lVar93 + lVar73)),0x60);
                                iVar62 = auVar116._0_4_;
                                iVar95 = auVar116._4_4_;
                                local_4b8 = (undefined1  [8])((ulong)local_288[0].data & 0xffffffff)
                                ;
                                break;
                              case 2:
                                auVar116 = pshuflw(ZEXT416(*(uint *)(lVar93 + lVar73)),
                                                   ZEXT416(*(uint *)(lVar93 + lVar73)),0x60);
                                iVar62 = auVar116._0_4_;
                                iVar95 = auVar116._4_4_;
                                break;
                              case 3:
                                stbtt__tesselate_curve
                                          (points,(int *)local_288,fVar115,fVar102,
                                           (float)(int)*(short *)(lVar93 + 4 + lVar73),
                                           (float)(int)*(short *)(lVar93 + 6 + lVar73),
                                           (float)(int)*(short *)(lVar93 + lVar73),
                                           (float)(int)*(short *)(lVar93 + 2 + lVar73),local_3d0,0);
                                goto LAB_00140712;
                              case 4:
                                stbtt__tesselate_cubic
                                          (points,(int *)local_288,fVar115,fVar102,
                                           (float)(int)*(short *)(lVar93 + 4 + lVar73),
                                           (float)(int)*(short *)(lVar93 + 6 + lVar73),
                                           (float)(int)*(short *)(lVar93 + 8 + lVar73),
                                           (float)(int)*(short *)(lVar93 + 10 + lVar73),
                                           (float)(int)*(short *)(lVar93 + lVar73),
                                           (float)(int)*(short *)(lVar93 + 2 + lVar73),local_3d0,0);
LAB_00140712:
                                auVar116 = pshuflw(ZEXT416(*(uint *)(lVar93 + lVar73)),
                                                   ZEXT416(*(uint *)(lVar93 + lVar73)),0x60);
                                fVar115 = (float)(auVar116._0_4_ >> 0x10);
                                fVar102 = (float)(auVar116._4_4_ >> 0x10);
                                puVar67 = local_288[0].data;
                              default:
                                goto switchD_001405eb_default;
                              }
                              puVar67 = (uchar *)CONCAT44(local_288[0].data._4_4_,
                                                          (int)local_288[0].data + 1);
                              fVar102 = (float)(iVar95 >> 0x10);
                              fVar115 = (float)(iVar62 >> 0x10);
                              if (points != (stbtt__point *)0x0) {
                                points[(int)local_288[0].data].x = fVar115;
                                points[(int)local_288[0].data].y = fVar102;
                              }
switchD_001405eb_default:
                              local_288[0].data = puVar67;
                              lVar73 = lVar73 + 0xe;
                            } while ((ulong)uVar97 * 0xe != lVar73);
                            lVar73 = (long)(int)uVar81;
                            uVar81 = local_478._0_4_;
                            auVar94 = local_4b8;
                          }
                          *(int *)((long)local_3f8 + lVar73 * 4) =
                               (int)local_288[0].data - SUB84(auVar94,0);
                          bVar99 = true;
                          uVar124 = uVar81;
                        }
                        else {
                          points = (stbtt__point *)
                                   ImGui::MemAlloc((long)(int)local_288[0].data << 3);
                          if (points != (stbtt__point *)0x0) goto LAB_001405a1;
                          points = (stbtt__point *)0x0;
                          bVar99 = false;
                          uVar124 = uVar81;
                        }
                        if (!bVar99) {
                          ImGui::MemFree(points);
                          ImGui::MemFree(local_3f8);
                          uVar64 = 0;
                          goto LAB_001407d2;
                        }
                        uVar81 = uVar124 + 1;
                        pvVar63 = local_3f8;
                      } while (uVar124 == 0);
                    }
                    local_3b0 = points;
                    if (points != (stbtt__point *)0x0) {
                      if ((int)uVar64 < 1) {
                        size = 0x14;
                      }
                      else {
                        uVar86 = 0;
                        lVar93 = 0;
                        do {
                          lVar93 = (long)(int)lVar93 + (long)*(int *)((long)pvVar63 + uVar86 * 4);
                          uVar86 = uVar86 + 1;
                        } while (uVar64 != uVar86);
                        size = lVar93 * 0x14 + 0x14;
                      }
                      psVar68 = (stbtt__edge *)ImGui::MemAlloc(size);
                      if (psVar68 != (stbtt__edge *)0x0) {
                        if ((int)uVar64 < 1) {
                          uVar97 = 0;
                        }
                        else {
                          uVar86 = 0;
                          uVar97 = 0;
                          iVar62 = 0;
                          do {
                            iVar95 = *(int *)((long)pvVar63 + uVar86 * 4);
                            if (0 < iVar95) {
                              uVar80 = (ulong)(iVar95 - 1);
                              uVar88 = 0;
                              do {
                                iVar92 = (int)uVar80;
                                fVar115 = local_3b0[(long)iVar62 + (long)iVar92].y;
                                fVar102 = local_3b0[(long)iVar62 + uVar88].y;
                                if ((fVar115 != fVar102) || (NAN(fVar115) || NAN(fVar102))) {
                                  iVar91 = (int)uVar88;
                                  iVar72 = iVar92;
                                  if (fVar115 <= fVar102) {
                                    iVar72 = iVar91;
                                    iVar91 = iVar92;
                                  }
                                  psVar68[(int)uVar97].invert = (uint)(fVar102 < fVar115);
                                  sVar5 = local_3b0[(long)iVar62 + (long)iVar72];
                                  sVar6 = local_3b0[(long)iVar62 + (long)iVar91];
                                  psVar87 = psVar68 + (int)uVar97;
                                  psVar87->x0 = sVar5.x * local_78 + 0.0;
                                  psVar87->y0 = sVar5.y * fStack_74 + 0.0;
                                  psVar87->x1 = sVar6.x * fStack_70 + 0.0;
                                  psVar87->y1 = sVar6.y * fStack_6c + 0.0;
                                  uVar97 = uVar97 + 1;
                                }
                                uVar80 = uVar88 & 0xffffffff;
                                uVar88 = uVar88 + 1;
                              } while ((long)uVar88 < (long)*(int *)((long)pvVar63 + uVar86 * 4));
                            }
                            iVar62 = iVar62 + iVar95;
                            uVar86 = uVar86 + 1;
                          } while (uVar86 != uVar64);
                        }
                        iVar62 = (int)local_468;
                        local_330 = psVar68;
                        stbtt__sort_edges_quicksort(psVar68,uVar97);
                        if (1 < (int)uVar97) {
                          uVar64 = 1;
                          do {
                            uVar2 = psVar68[uVar64].x0;
                            uVar7 = psVar68[uVar64].y0;
                            iVar95 = psVar68[uVar64].invert;
                            local_288[0].cursor = iVar95;
                            local_288[0].data = *(uchar **)&psVar68[uVar64].x1;
                            uVar86 = uVar64 & 0xffffffff;
                            do {
                              uVar81 = (uint)uVar86;
                              if ((int)uVar81 < 1) break;
                              fVar115 = psVar68[uVar86 - 1].y0;
                              if ((float)uVar7 < fVar115) {
                                psVar87 = psVar68 + uVar86;
                                psVar87->invert = psVar87[-1].invert;
                                fVar102 = psVar87[-1].y0;
                                fVar141 = psVar87[-1].x1;
                                fVar142 = psVar87[-1].y1;
                                psVar87->x0 = psVar87[-1].x0;
                                psVar87->y0 = fVar102;
                                psVar87->x1 = fVar141;
                                psVar87->y1 = fVar142;
                                uVar86 = (ulong)(uVar81 - 1);
                              }
                              uVar81 = (uint)uVar86;
                            } while ((float)uVar7 < fVar115);
                            if (uVar64 != uVar81) {
                              psVar68[(int)uVar81].x0 = (float)uVar2;
                              psVar68[(int)uVar81].y0 = (float)uVar7;
                              *(uchar **)&psVar68[(int)uVar81].x1 = local_288[0].data;
                              psVar68[(int)uVar81].invert = iVar95;
                            }
                            uVar64 = uVar64 + 1;
                          } while (uVar64 != uVar97);
                        }
                        uVar81 = (int)local_3f0 - iVar62;
                        local_3f0 = (ulong)uVar81;
                        local_488._0_8_ = (stbtt__active_edge *)0x0;
                        scanline = local_288;
                        if (0x3f < (int)uVar81) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3fc * 8 + 4);
                        }
                        uVar81 = (int)local_3c8 - (int)local_3d8;
                        local_3c8 = (ulong)uVar81;
                        psVar68[(int)uVar97].y0 = (float)(local_3e8._0_4_ + local_404) + 1.0;
                        local_3f8 = pvVar63;
                        if (uVar81 < 0x7fffffff) {
                          local_3a8 = local_3c0 + (long)local_3a8 * local_460 + local_458._0_8_;
                          local_374 = (float)(int)uVar61;
                          local_2e0 = (long)(int)local_3fc;
                          local_390 = (float *)((long)&scanline->data + local_2e0 * 4);
                          local_348 = local_390 + 1;
                          local_2d0 = local_2e0 * 4;
                          local_400 = (float)(int)local_3fc;
                          local_2d8 = (long)(int)(uint)local_3f0 * 4 + 8;
                          local_3a0 = 0;
                          local_398 = 0;
                          ptr_00 = (undefined8 *)0x0;
                          local_3cc = 0;
                          psVar96 = (stbtt__active_edge *)0x0;
                          local_378 = local_404;
                          do {
                            fVar102 = (float)local_378;
                            fVar115 = fVar102 + 1.0;
                            memset(scanline,0,local_2d0);
                            memset(local_390,0,local_2d8);
                            if ((stbtt__active_edge *)local_488._0_8_ != (stbtt__active_edge *)0x0)
                            {
                              psVar69 = (stbtt__active_edge *)local_488._0_8_;
                              psVar77 = (stbtt__active_edge *)local_488;
                              do {
                                psVar78 = psVar69;
                                if (psVar69->ey <= fVar102) {
                                  psVar77->next = psVar69->next;
                                  psVar69->direction = 0.0;
                                  psVar69->next = psVar96;
                                  psVar78 = psVar77;
                                  psVar96 = psVar69;
                                }
                                psVar69 = psVar78->next;
                                psVar77 = psVar78;
                              } while (psVar69 != (stbtt__active_edge *)0x0);
                            }
                            fVar141 = psVar68->y0;
                            if (fVar141 <= fVar115) {
                              bVar99 = local_404 != 0;
                              bVar100 = (int)local_398 == 0;
                              do {
                                if ((fVar141 != psVar68->y1) || (NAN(fVar141) || NAN(psVar68->y1)))
                                {
                                  if (psVar96 == (stbtt__active_edge *)0x0) {
                                    puVar71 = ptr_00;
                                    psVar69 = psVar96;
                                    if (local_3cc == 0) {
                                      puVar71 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar71 == (undefined8 *)0x0) {
                                        psVar77 = (stbtt__active_edge *)0x0;
                                        goto LAB_00141287;
                                      }
                                      *puVar71 = ptr_00;
                                      local_3cc = 800;
                                    }
                                    lVar93 = (long)local_3cc;
                                    local_3cc = local_3cc + -1;
                                    psVar77 = (stbtt__active_edge *)(puVar71 + lVar93 * 4 + -3);
                                    ptr_00 = puVar71;
                                  }
                                  else {
                                    psVar69 = psVar96->next;
                                    psVar77 = psVar96;
                                  }
LAB_00141287:
                                  psVar96 = psVar69;
                                  if (psVar77 != (stbtt__active_edge *)0x0) {
                                    uVar3 = psVar68->x0;
                                    uVar8 = psVar68->y0;
                                    uVar4 = psVar68->x1;
                                    uVar9 = psVar68->y1;
                                    fVar141 = ((float)uVar4 - (float)uVar3) /
                                              ((float)uVar9 - (float)uVar8);
                                    psVar77->fdx = fVar141;
                                    psVar77->fdy = (float)(-(uint)(fVar141 != 0.0) &
                                                          (uint)(1.0 / fVar141));
                                    psVar77->fx = ((fVar102 - (float)uVar8) * fVar141 + (float)uVar3
                                                  ) - local_374;
                                    psVar77->direction =
                                         *(float *)(&DAT_0018c3b4 +
                                                   (ulong)(psVar68->invert == 0) * 4);
                                    psVar77->sy = (float)uVar8;
                                    psVar77->ey = (float)uVar9;
                                    psVar77->next = (stbtt__active_edge *)0x0;
                                    if ((float)uVar9 < fVar102 && (bVar100 && bVar99)) {
                                      psVar77->ey = fVar102;
                                    }
                                    psVar77->next = (stbtt__active_edge *)local_488._0_8_;
                                    local_488._0_8_ = psVar77;
                                  }
                                }
                                fVar141 = psVar68[1].y0;
                                psVar68 = psVar68 + 1;
                              } while (fVar141 <= fVar115);
                            }
                            local_2c8 = ptr_00;
                            ptr_00 = local_2c8;
                            iVar62 = local_378;
                            fVar141 = local_318;
                            for (psVar69 = (stbtt__active_edge *)local_488._0_8_;
                                local_318 = fVar141, local_2c8 = ptr_00,
                                psVar69 != (stbtt__active_edge *)0x0; psVar69 = psVar69->next) {
                              local_318 = psVar69->fx;
                              fVar142 = psVar69->fdx;
                              local_378 = iVar62;
                              if ((fVar142 != 0.0) || (NAN(fVar142))) {
                                fVar147 = fVar142 + local_318;
                                fVar143 = psVar69->sy;
                                fVar144 = (float)(~-(uint)(fVar102 < fVar143) & (uint)local_318 |
                                                 (uint)((fVar143 - fVar102) * fVar142 + local_318) &
                                                 -(uint)(fVar102 < fVar143));
                                if (0.0 <= fVar144) {
                                  fVar148 = psVar69->ey;
                                  fVar149 = (float)(-(uint)(fVar148 < fVar115) &
                                                    (uint)((fVar148 - fVar102) * fVar142 + local_318
                                                          ) |
                                                   ~-(uint)(fVar148 < fVar115) & (uint)fVar147);
                                  if (((0.0 <= fVar149) && (fVar144 < local_400)) &&
                                     (fVar149 < local_400)) {
                                    if (fVar143 <= fVar102) {
                                      fVar143 = fVar102;
                                    }
                                    iVar62 = (int)fVar144;
                                    if (fVar115 <= fVar148) {
                                      fVar148 = fVar115;
                                    }
                                    if (iVar62 == (int)fVar149) {
                                      lVar93 = (long)iVar62;
                                      *(float *)((long)&scanline->data + lVar93 * 4) =
                                           (((fVar149 - (float)iVar62) + (fVar144 - (float)iVar62))
                                            * -0.5 + 1.0) * psVar69->direction * (fVar148 - fVar143)
                                           + *(float *)((long)&scanline->data + lVar93 * 4);
                                      fVar147 = (fVar148 - fVar143) * psVar69->direction;
                                    }
                                    else {
                                      fVar142 = psVar69->fdy;
                                      fVar150 = fVar149;
                                      if (fVar149 < fVar144) {
                                        fVar158 = fVar102 - fVar143;
                                        fVar143 = (fVar102 - fVar148) + fVar115;
                                        fVar142 = -fVar142;
                                        local_318 = fVar147;
                                        fVar150 = fVar144;
                                        fVar148 = fVar158 + fVar115;
                                        fVar144 = fVar149;
                                      }
                                      iVar95 = (int)fVar150;
                                      iVar62 = (int)fVar144 + 1;
                                      fVar158 = ((float)iVar62 - local_318) * fVar142 + fVar102;
                                      fVar147 = psVar69->direction;
                                      fVar149 = (fVar158 - fVar143) * fVar147;
                                      lVar93 = (long)(int)fVar144;
                                      *(float *)((long)&scanline->data + lVar93 * 4) =
                                           (((fVar144 - (float)(int)fVar144) + 1.0) * -0.5 + 1.0) *
                                           fVar149 + *(float *)((long)&scanline->data + lVar93 * 4);
                                      if (iVar95 - iVar62 != 0 && iVar62 <= iVar95) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar93 * 4 + 4) =
                                               fVar142 * fVar147 * 0.5 + fVar149 +
                                               *(float *)((long)&scanline->data + lVar93 * 4 + 4);
                                          fVar149 = fVar149 + fVar142 * fVar147;
                                          lVar93 = lVar93 + 1;
                                        } while (iVar95 + -1 != (int)lVar93);
                                      }
                                      lVar93 = (long)iVar95;
                                      *(float *)((long)&scanline->data + lVar93 * 4) =
                                           (fVar148 - (fVar142 * (float)(iVar95 - iVar62) + fVar158)
                                           ) * (((fVar150 - (float)iVar95) + 0.0) * -0.5 + 1.0) *
                                               fVar147 + fVar149 +
                                           *(float *)((long)&scanline->data + lVar93 * 4);
                                      fVar147 = (fVar148 - fVar143) * fVar147;
                                    }
                                    local_348[lVar93] = fVar147 + local_348[lVar93];
                                    goto LAB_00141115;
                                  }
                                }
                                if ((uint)local_3f0 < 0x7fffffff) {
                                  uStack_314 = 0;
                                  uStack_310 = 0;
                                  uStack_30c = 0;
                                  fVar143 = fVar102;
                                  local_3e8 = ZEXT416((uint)fVar147);
                                  local_370 = fVar142;
                                  uVar61 = 0;
                                  do {
                                    fVar142 = (float)(int)uVar61;
                                    uVar97 = uVar61 + 1;
                                    fVar147 = (float)(int)uVar97;
                                    fVar141 = (fVar142 - local_318) / local_370 + fVar143;
                                    fVar144 = (fVar147 - local_318) / local_370 + fVar143;
                                    local_4b8._0_4_ = fVar141;
                                    local_478._0_4_ = fVar142;
                                    fVar148 = local_3e8._0_4_;
                                    fVar102 = fVar143;
                                    if ((fVar142 <= local_318) || (fVar148 <= fVar147)) {
                                      if ((fVar142 <= fVar148) || (local_318 <= fVar147)) {
                                        fVar149 = local_318;
                                        if (((fVar142 <= local_318) || (fVar148 <= fVar142)) &&
                                           ((fVar142 <= fVar148 || (local_318 <= fVar142)))) {
                                          if (((local_318 < fVar147) && (fVar147 < fVar148)) ||
                                             ((fVar142 = local_318, fVar141 = fVar143,
                                              fVar148 < fVar147 && (fVar147 < local_318)))) {
                                            local_458._0_4_ = fVar144;
                                            fVar142 = local_318;
                                            goto LAB_00140dfa;
                                          }
                                          goto LAB_00140eb1;
                                        }
                                      }
                                      else {
                                        local_458._0_4_ = fVar144;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar61,psVar69,local_318,
                                                   fVar143,fVar147,fVar144);
                                        fVar149 = fVar147;
                                        fVar142 = (float)local_478._0_4_;
                                        fVar143 = (float)local_458._0_4_;
                                      }
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar61,psVar69,fVar149,fVar143,
                                                 fVar142,fVar141);
                                      fVar142 = (float)local_478._0_4_;
                                    }
                                    else {
                                      local_458._0_4_ = fVar144;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar61,psVar69,local_318,fVar143,
                                                 fVar142,fVar141);
                                      fVar142 = (float)local_478._0_4_;
                                      fVar144 = (float)local_458._0_4_;
                                      fVar143 = fVar141;
LAB_00140dfa:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar61,psVar69,fVar142,fVar143,
                                                 fVar147,fVar144);
                                      fVar142 = fVar147;
                                      fVar141 = (float)local_458._0_4_;
                                    }
LAB_00140eb1:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar61,psVar69,fVar142,fVar141,
                                               local_3e8._0_4_,fVar115);
                                    fVar143 = fVar102;
                                    fVar141 = local_318;
                                    uVar61 = uVar97;
                                  } while (local_3fc != uVar97);
                                }
                              }
                              else if (local_318 < local_400) {
                                if (0.0 <= local_318) {
                                  iVar62 = (int)local_318;
                                  uStack_314 = 0;
                                  uStack_310 = 0;
                                  uStack_30c = 0;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,iVar62,psVar69,local_318,fVar102,
                                             local_318,fVar115);
                                  iVar62 = iVar62 + 1;
                                  fVar142 = local_318;
                                }
                                else {
                                  iVar62 = 0;
                                  fVar142 = local_318;
                                  local_318 = fVar141;
                                }
                                stbtt__handle_clipped_edge
                                          (local_390,iVar62,psVar69,fVar142,fVar102,fVar142,fVar115)
                                ;
                                fVar141 = local_318;
                              }
LAB_00141115:
                              local_318 = fVar141;
                              ptr_00 = local_2c8;
                              iVar62 = local_378;
                              fVar141 = local_318;
                            }
                            psVar69 = (stbtt__active_edge *)local_488._0_8_;
                            if ((uint)local_3f0 < 0x7fffffff) {
                              fVar115 = 0.0;
                              psVar70 = scanline;
                              uVar64 = local_3a0;
                              lVar93 = local_2e0;
                              do {
                                fVar115 = fVar115 + *(float *)((long)&psVar70->data + local_2e0 * 4)
                                ;
                                iVar95 = (int)(ABS(*(float *)&psVar70->data + fVar115) * 255.0 + 0.5
                                              );
                                uVar85 = (uchar)iVar95;
                                if (0xfe < iVar95) {
                                  uVar85 = 0xff;
                                }
                                local_3a8[(int)uVar64] = uVar85;
                                uVar64 = (ulong)((int)uVar64 + 1);
                                psVar70 = (stbtt__buf *)((long)&psVar70->data + 4);
                                lVar93 = lVar93 + -1;
                              } while (lVar93 != 0);
                            }
                            for (; psVar69 != (stbtt__active_edge *)0x0; psVar69 = psVar69->next) {
                              psVar69->fx = psVar69->fdx + psVar69->fx;
                            }
                            local_378 = iVar62 + 1;
                            iVar95 = (int)local_398;
                            local_398 = (ulong)(iVar95 + 1);
                            local_3a0 = (ulong)(uint)((int)local_3a0 + local_37c);
                            pvVar66 = local_3f8;
                            psVar87 = local_330;
                          } while (iVar95 != (int)local_3c8);
                        }
                        else {
                          ptr_00 = (undefined8 *)0x0;
                          pvVar66 = pvVar63;
                          iVar62 = local_378;
                          psVar87 = local_330;
                        }
                        while (local_378 = iVar62, psVar68 = local_330, pvVar63 = local_3f8,
                              local_3f8 = pvVar66, local_330 = psVar87, ptr_00 != (undefined8 *)0x0)
                        {
                          puVar71 = (undefined8 *)*ptr_00;
                          ImGui::MemFree(ptr_00);
                          ptr_00 = puVar71;
                          pvVar66 = local_3f8;
                          iVar62 = local_378;
                          psVar87 = local_330;
                          local_330 = psVar68;
                          local_3f8 = pvVar63;
                        }
                        if (scanline != local_288) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(psVar68);
                      }
                      ImGui::MemFree(pvVar63);
                      ImGui::MemFree(local_3b0);
                    }
                  }
                }
                ImGui::MemFree((void *)CONCAT44(local_410._4_4_,(stbtt_uint32)local_410));
                auVar116 = _DAT_0018df70;
                if (1 < (byte)local_338) {
                  uVar53 = *(ushort *)(local_3b8 + 4);
                  local_288[0].data = (uchar *)0x0;
                  uVar61 = CONCAT22(0,*(ushort *)(local_3b8 + 6));
                  local_4b8._0_4_ = uVar61;
                  if (uVar61 != 0) {
                    puVar67 = local_3c0 +
                              (ulong)*(ushort *)(local_3b8 + 10) * local_460 +
                              (ulong)*(ushort *)(local_3b8 + 8);
                    iVar62 = (uint)uVar53 - (int)local_468;
                    uVar64 = (ulong)(iVar62 + 1);
                    uVar97 = 0;
                    do {
                      uVar86 = local_338;
                      memset(local_288,0,local_338);
                      auVar116 = _DAT_0018df70;
                      switch((int)uVar86) {
                      case 2:
                        if (iVar62 < 0) {
LAB_0014164a:
                          uVar88 = 0;
                          uVar86 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar86 = 0;
                          do {
                            bVar101 = puVar67[uVar88];
                            bVar109 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 2 & 7)) =
                                 bVar101;
                            uVar81 = (int)uVar86 + ((uint)bVar101 - (uint)bVar109);
                            uVar86 = (ulong)uVar81;
                            puVar67[uVar88] = (uchar)(uVar81 >> 1);
                            uVar88 = uVar88 + 1;
                          } while (uVar64 != uVar88);
                        }
                        break;
                      case 3:
                        if (iVar62 < 0) goto LAB_0014164a;
                        uVar88 = 0;
                        uVar86 = 0;
                        do {
                          bVar101 = puVar67[uVar88];
                          bVar109 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 3 & 7)) =
                               bVar101;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar101 - (uint)bVar109));
                          puVar67[uVar88] = (uchar)(uVar86 / 3);
                          uVar88 = uVar88 + 1;
                        } while (uVar64 != uVar88);
                        break;
                      case 4:
                        if (iVar62 < 0) goto LAB_0014164a;
                        uVar88 = 0;
                        uVar86 = 0;
                        do {
                          bVar101 = puVar67[uVar88];
                          uVar80 = (ulong)((uint)uVar88 & 7);
                          bVar109 = *(byte *)((long)&local_288[0].data + uVar80);
                          *(byte *)((long)&local_288[0].data + (uVar80 ^ 4)) = bVar101;
                          uVar81 = (int)uVar86 + ((uint)bVar101 - (uint)bVar109);
                          uVar86 = (ulong)uVar81;
                          puVar67[uVar88] = (uchar)(uVar81 >> 2);
                          uVar88 = uVar88 + 1;
                        } while (uVar64 != uVar88);
                        break;
                      case 5:
                        if (iVar62 < 0) goto LAB_0014164a;
                        uVar88 = 0;
                        uVar86 = 0;
                        do {
                          bVar101 = puVar67[uVar88];
                          bVar109 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 5 & 7)) =
                               bVar101;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar101 - (uint)bVar109));
                          puVar67[uVar88] = (uchar)(uVar86 / 5);
                          uVar88 = uVar88 + 1;
                        } while (uVar64 != uVar88);
                        break;
                      default:
                        uVar88 = 0;
                        uVar86 = 0;
                        if (-1 < iVar62) {
                          do {
                            bVar101 = puVar67[uVar88];
                            bVar109 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data +
                                     (ulong)((int)local_468 + (uint)uVar88 & 7)) = bVar101;
                            uVar86 = (ulong)((int)uVar86 + ((uint)bVar101 - (uint)bVar109));
                            puVar67[uVar88] = (uchar)(uVar86 / (local_468 & 0xffffffff));
                            uVar88 = uVar88 + 1;
                          } while (uVar64 != uVar88);
                        }
                      }
                      if ((int)uVar88 < (int)(uint)uVar53) {
                        uVar88 = uVar88 & 0xffffffff;
                        do {
                          uVar86 = (ulong)((int)uVar86 -
                                          (uint)*(byte *)((long)&local_288[0].data +
                                                         (ulong)((uint)uVar88 & 7)));
                          puVar67[uVar88] = (uchar)(uVar86 / (local_468 & 0xffffffff));
                          uVar88 = uVar88 + 1;
                        } while ((int)uVar88 < (int)(uint)uVar53);
                      }
                      puVar67 = puVar67 + local_460;
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar61);
                  }
                }
                if (1 < (byte)local_340) {
                  uVar53 = *(ushort *)(local_3b8 + 6);
                  local_288[0].data = (uchar *)0x0;
                  uVar61 = CONCAT22(0,*(ushort *)(local_3b8 + 4));
                  local_4b8._0_4_ = uVar61;
                  if (uVar61 != 0) {
                    pbVar84 = local_3c0 +
                              (ulong)*(ushort *)(local_3b8 + 10) * local_460 +
                              (ulong)*(ushort *)(local_3b8 + 8);
                    local_478._0_4_ = (uint)uVar53 - (int)local_3d8;
                    uVar64 = (ulong)((uint)uVar53 + (int)local_358 + 1);
                    uVar97 = 0;
                    do {
                      uVar86 = local_340;
                      memset(local_288,0,local_340);
                      auVar116 = _DAT_0018df70;
                      switch((int)uVar86) {
                      case 2:
                        if ((int)local_478._0_4_ < 0) {
LAB_00141974:
                          uVar88 = 0;
                          uVar86 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar86 = 0;
                          pbVar89 = pbVar84;
                          do {
                            bVar101 = *pbVar89;
                            bVar109 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 2 & 7)) =
                                 bVar101;
                            uVar81 = (int)uVar86 + ((uint)bVar101 - (uint)bVar109);
                            uVar86 = (ulong)uVar81;
                            *pbVar89 = (byte)(uVar81 >> 1);
                            uVar88 = uVar88 + 1;
                            pbVar89 = pbVar89 + local_460;
                          } while (uVar64 != uVar88);
                        }
                        break;
                      case 3:
                        if ((int)local_478._0_4_ < 0) goto LAB_00141974;
                        uVar88 = 0;
                        uVar86 = 0;
                        pbVar89 = pbVar84;
                        do {
                          bVar101 = *pbVar89;
                          bVar109 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 3 & 7)) =
                               bVar101;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar101 - (uint)bVar109));
                          *pbVar89 = (byte)(uVar86 / 3);
                          uVar88 = uVar88 + 1;
                          pbVar89 = pbVar89 + local_460;
                        } while (uVar64 != uVar88);
                        break;
                      case 4:
                        if ((int)local_478._0_4_ < 0) goto LAB_00141974;
                        uVar88 = 0;
                        uVar86 = 0;
                        pbVar89 = pbVar84;
                        do {
                          bVar101 = *pbVar89;
                          uVar80 = (ulong)((uint)uVar88 & 7);
                          bVar109 = *(byte *)((long)&local_288[0].data + uVar80);
                          *(byte *)((long)&local_288[0].data + (uVar80 ^ 4)) = bVar101;
                          uVar81 = (int)uVar86 + ((uint)bVar101 - (uint)bVar109);
                          uVar86 = (ulong)uVar81;
                          *pbVar89 = (byte)(uVar81 >> 2);
                          uVar88 = uVar88 + 1;
                          pbVar89 = pbVar89 + local_460;
                        } while (uVar64 != uVar88);
                        break;
                      case 5:
                        if ((int)local_478._0_4_ < 0) goto LAB_00141974;
                        uVar88 = 0;
                        uVar86 = 0;
                        pbVar89 = pbVar84;
                        do {
                          bVar101 = *pbVar89;
                          bVar109 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 5 & 7)) =
                               bVar101;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar101 - (uint)bVar109));
                          *pbVar89 = (byte)(uVar86 / 5);
                          uVar88 = uVar88 + 1;
                          pbVar89 = pbVar89 + local_460;
                        } while (uVar64 != uVar88);
                        break;
                      default:
                        if ((int)local_478._0_4_ < 0) {
                          uVar88 = 0;
                          uVar86 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar86 = 0;
                          pbVar89 = pbVar84;
                          do {
                            bVar101 = *pbVar89;
                            bVar109 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data +
                                     (ulong)((int)local_3d8 + (uint)uVar88 & 7)) = bVar101;
                            uVar86 = (ulong)((int)uVar86 + ((uint)bVar101 - (uint)bVar109));
                            *pbVar89 = (byte)(uVar86 / (local_3d8 & 0xffffffff));
                            uVar88 = uVar88 + 1;
                            pbVar89 = pbVar89 + local_460;
                          } while (uVar64 != uVar88);
                        }
                      }
                      if ((int)uVar88 < (int)(uint)uVar53) {
                        uVar88 = (ulong)(int)uVar88;
                        pbVar89 = pbVar84 + local_460 * uVar88;
                        do {
                          uVar86 = (ulong)((int)uVar86 -
                                          (uint)*(byte *)((long)&local_288[0].data +
                                                         (ulong)((uint)uVar88 & 7)));
                          *pbVar89 = (byte)(uVar86 / (local_3d8 & 0xffffffff));
                          uVar88 = uVar88 + 1;
                          pbVar89 = pbVar89 + local_460;
                        } while (uVar53 != uVar88);
                      }
                      pbVar84 = pbVar84 + 1;
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar61);
                  }
                }
                local_2f0[4] = (float)(int)(short)((short)(local_380 << 8) + (short)local_384) *
                               local_328;
                *(ulong *)(local_2f0 + 2) =
                     CONCAT44((float)local_36c * (float)local_58._4_4_ + (float)local_48._4_4_,
                              (float)local_368 * (float)local_58._0_4_ + (float)local_48._0_4_);
                uVar151 = *(undefined4 *)(local_3b8 + 8);
                *local_2f0 = uVar151;
                uVar61 = *(uint *)(local_3b8 + 4);
                uVar53 = (ushort)(uVar61 >> 0x10);
                local_2f0[1] = CONCAT22((short)((uint)uVar151 >> 0x10) + uVar53,
                                        (short)uVar151 + (short)uVar61);
                local_2f0[5] = (float)(int)((uVar61 & 0xffff) + local_368) * (float)local_58._0_4_ +
                               (float)local_48._0_4_;
                local_2f0[6] = (float)(int)((uint)uVar53 + local_36c) * (float)local_58._4_4_ +
                               (float)local_48._4_4_;
                lVar93 = local_2f8;
                lVar73 = local_2e8;
                psVar82 = local_350;
                auVar118 = _DAT_001811f0;
              }
            }
            lVar73 = lVar73 + 1;
            uVar61 = in_stack_fffffffffffffb64;
          } while (lVar73 < psVar82[1].fontstart);
        }
        fVar115 = local_308[local_300].RasterizerMultiply;
        _local_4b8 = ZEXT416((uint)fVar115);
        if ((fVar115 != 1.0) || (NAN(fVar115))) {
          local_4b8._4_4_ = fVar115;
          local_4b8._0_4_ = fVar115;
          fStack_4b0 = fVar115;
          fStack_4ac = fVar115;
          lVar93 = 0;
          uVar61 = 0;
          uVar97 = 1;
          uVar81 = 2;
          uVar124 = 3;
          uVar125 = 4;
          uVar127 = 5;
          uVar128 = 6;
          uVar129 = 7;
          uVar130 = 8;
          uVar131 = 9;
          uVar132 = 10;
          uVar133 = 0xb;
          uVar134 = 0xc;
          uVar136 = 0xd;
          uVar137 = 0xe;
          uVar138 = 0xf;
          do {
            fVar161 = (((float)(uVar130 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar130 & 0xffff | 0x4b000000)) * fVar115;
            fVar166 = (((float)(uVar131 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar131 & 0xffff | 0x4b000000)) * fVar115;
            fVar167 = (((float)(uVar132 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar132 & 0xffff | 0x4b000000)) * fVar115;
            fVar168 = (((float)(uVar133 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar133 & 0xffff | 0x4b000000)) * fVar115;
            fVar150 = (((float)(uVar134 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar134 & 0xffff | 0x4b000000)) * fVar115;
            fVar158 = (((float)(uVar136 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar136 & 0xffff | 0x4b000000)) * fVar115;
            fVar159 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar137 & 0xffff | 0x4b000000)) * fVar115;
            fVar160 = (((float)(uVar138 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar138 & 0xffff | 0x4b000000)) * fVar115;
            fVar144 = (((float)(uVar61 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar61 & 0xffff | 0x4b000000)) * fVar115;
            fVar147 = (((float)(uVar97 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar97 & 0xffff | 0x4b000000)) * fVar115;
            fVar148 = (((float)(uVar81 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar81 & 0xffff | 0x4b000000)) * fVar115;
            fVar149 = (((float)(uVar124 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar124 & 0xffff | 0x4b000000)) * fVar115;
            fVar102 = (((float)(uVar125 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar125 & 0xffff | 0x4b000000)) * fVar115;
            fVar141 = (((float)(uVar127 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar127 & 0xffff | 0x4b000000)) * fVar115;
            fVar142 = (((float)(uVar128 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar128 & 0xffff | 0x4b000000)) * fVar115;
            fVar143 = (((float)(uVar129 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar129 & 0xffff | 0x4b000000)) * fVar115;
            auVar140._0_4_ = (int)fVar102;
            auVar140._4_4_ = (int)fVar141;
            auVar140._8_4_ = (int)fVar142;
            auVar140._12_4_ = (int)fVar143;
            auVar179._0_4_ = auVar140._0_4_ >> 0x1f;
            auVar179._4_4_ = auVar140._4_4_ >> 0x1f;
            auVar179._8_4_ = auVar140._8_4_ >> 0x1f;
            auVar179._12_4_ = auVar140._12_4_ >> 0x1f;
            auVar139._0_4_ = (int)(fVar102 - 2.1474836e+09);
            auVar139._4_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar139._8_4_ = (int)(fVar142 - 2.1474836e+09);
            auVar139._12_4_ = (int)(fVar143 - 2.1474836e+09);
            auVar140 = auVar139 & auVar179 | auVar140;
            auVar146._0_4_ = (int)fVar144;
            auVar146._4_4_ = (int)fVar147;
            auVar146._8_4_ = (int)fVar148;
            auVar146._12_4_ = (int)fVar149;
            auVar180._0_4_ = auVar146._0_4_ >> 0x1f;
            auVar180._4_4_ = auVar146._4_4_ >> 0x1f;
            auVar180._8_4_ = auVar146._8_4_ >> 0x1f;
            auVar180._12_4_ = auVar146._12_4_ >> 0x1f;
            auVar145._0_4_ = (int)(fVar144 - 2.1474836e+09);
            auVar145._4_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar145._8_4_ = (int)(fVar148 - 2.1474836e+09);
            auVar145._12_4_ = (int)(fVar149 - 2.1474836e+09);
            auVar146 = auVar145 & auVar180 | auVar146;
            auVar175._0_4_ = (int)fVar150;
            auVar175._4_4_ = (int)fVar158;
            auVar175._8_4_ = (int)fVar159;
            auVar175._12_4_ = (int)fVar160;
            auVar183._0_4_ = auVar175._0_4_ >> 0x1f;
            auVar183._4_4_ = auVar175._4_4_ >> 0x1f;
            auVar183._8_4_ = auVar175._8_4_ >> 0x1f;
            auVar183._12_4_ = auVar175._12_4_ >> 0x1f;
            auVar174._0_4_ = (int)(fVar150 - 2.1474836e+09);
            auVar174._4_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar174._8_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar174._12_4_ = (int)(fVar160 - 2.1474836e+09);
            auVar175 = auVar174 & auVar183 | auVar175;
            auVar163._0_4_ = (int)fVar161;
            auVar163._4_4_ = (int)fVar166;
            auVar163._8_4_ = (int)fVar167;
            auVar163._12_4_ = (int)fVar168;
            auVar181._0_4_ = auVar163._0_4_ >> 0x1f;
            auVar181._4_4_ = auVar163._4_4_ >> 0x1f;
            auVar181._8_4_ = auVar163._8_4_ >> 0x1f;
            auVar181._12_4_ = auVar163._12_4_ >> 0x1f;
            auVar162._0_4_ = (int)(fVar161 - 2.1474836e+09);
            auVar162._4_4_ = (int)(fVar166 - 2.1474836e+09);
            auVar162._8_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar162._12_4_ = (int)(fVar168 - 2.1474836e+09);
            auVar163 = auVar162 & auVar181 | auVar163;
            auVar118 = auVar163 ^ _DAT_001811f0;
            auVar156._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar156._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar156._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar156._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar118 = ~auVar156 & auVar116 | auVar163 & auVar156;
            auVar164 = auVar175 ^ _DAT_001811f0;
            auVar182._0_4_ = -(uint)(auVar164._0_4_ < -0x7fffff01);
            auVar182._4_4_ = -(uint)(auVar164._4_4_ < -0x7fffff01);
            auVar182._8_4_ = -(uint)(auVar164._8_4_ < -0x7fffff01);
            auVar182._12_4_ = -(uint)(auVar164._12_4_ < -0x7fffff01);
            auVar164 = ~auVar182 & auVar116 | auVar175 & auVar182;
            sVar13 = auVar118._0_2_;
            cVar19 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0] - (0xff < sVar13);
            sVar13 = auVar118._2_2_;
            sVar54 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar118[2] - (0xff < sVar13),cVar19
                             );
            sVar13 = auVar118._4_2_;
            cVar110 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[4] - (0xff < sVar13);
            sVar13 = auVar118._6_2_;
            uVar151 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar118[6] - (0xff < sVar13),
                               CONCAT12(cVar110,sVar54));
            sVar13 = auVar118._8_2_;
            cVar20 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[8] - (0xff < sVar13);
            sVar13 = auVar118._10_2_;
            uVar152 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar118[10] - (0xff < sVar13),
                               CONCAT14(cVar20,uVar151));
            sVar13 = auVar118._12_2_;
            cVar21 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0xc] - (0xff < sVar13);
            sVar13 = auVar118._14_2_;
            uVar153 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar118[0xe] - (0xff < sVar13),
                               CONCAT16(cVar21,uVar152));
            sVar13 = auVar164._0_2_;
            cVar22 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0] - (0xff < sVar13);
            sVar13 = auVar164._2_2_;
            auVar154._0_10_ =
                 CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar164[2] - (0xff < sVar13),
                          CONCAT18(cVar22,uVar153));
            sVar13 = auVar164._4_2_;
            cVar23 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[4] - (0xff < sVar13);
            auVar154[10] = cVar23;
            sVar13 = auVar164._6_2_;
            auVar154[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar164[6] - (0xff < sVar13);
            sVar13 = auVar164._8_2_;
            cVar24 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[8] - (0xff < sVar13);
            auVar155[0xc] = cVar24;
            auVar155._0_12_ = auVar154;
            sVar13 = auVar164._10_2_;
            auVar155[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar164[10] - (0xff < sVar13);
            sVar13 = auVar164._12_2_;
            cVar111 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0xc] - (0xff < sVar13);
            auVar157[0xe] = cVar111;
            auVar157._0_14_ = auVar155;
            sVar13 = auVar164._14_2_;
            auVar157[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0xe] - (0xff < sVar13);
            auVar118 = auVar146 ^ _DAT_001811f0;
            auVar176._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar176._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar176._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar176._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar164 = ~auVar176 & auVar116 | auVar146 & auVar176;
            auVar118 = auVar140 ^ _DAT_001811f0;
            auVar165._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar165._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar165._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar165._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar118 = ~auVar165 & auVar116 | auVar140 & auVar165;
            sVar13 = auVar164._0_2_;
            cVar25 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0] - (0xff < sVar13);
            sVar13 = auVar164._2_2_;
            sVar112 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar164[2] - (0xff < sVar13),
                               cVar25);
            sVar13 = auVar164._4_2_;
            cVar26 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[4] - (0xff < sVar13);
            sVar13 = auVar164._6_2_;
            uVar169 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar164[6] - (0xff < sVar13),
                               CONCAT12(cVar26,sVar112));
            sVar13 = auVar164._8_2_;
            cVar27 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[8] - (0xff < sVar13);
            sVar13 = auVar164._10_2_;
            uVar170 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar164[10] - (0xff < sVar13),
                               CONCAT14(cVar27,uVar169));
            sVar13 = auVar164._12_2_;
            cVar28 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0xc] - (0xff < sVar13);
            sVar13 = auVar164._14_2_;
            uVar171 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar164[0xe] - (0xff < sVar13),
                               CONCAT16(cVar28,uVar170));
            sVar13 = auVar118._0_2_;
            cVar29 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0] - (0xff < sVar13);
            sVar13 = auVar118._2_2_;
            auVar172._0_10_ =
                 CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar118[2] - (0xff < sVar13),
                          CONCAT18(cVar29,uVar171));
            sVar13 = auVar118._4_2_;
            cVar30 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[4] - (0xff < sVar13);
            auVar172[10] = cVar30;
            sVar13 = auVar118._6_2_;
            auVar172[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar118[6] - (0xff < sVar13);
            sVar13 = auVar118._8_2_;
            cVar31 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[8] - (0xff < sVar13);
            auVar173[0xc] = cVar31;
            auVar173._0_12_ = auVar172;
            sVar13 = auVar118._10_2_;
            auVar173[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar118[10] - (0xff < sVar13);
            sVar13 = auVar118._12_2_;
            cVar32 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0xc] - (0xff < sVar13);
            auVar177[0xe] = cVar32;
            auVar177._0_14_ = auVar173;
            sVar13 = auVar118._14_2_;
            auVar177[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0xe] - (0xff < sVar13);
            sVar13 = (short)((uint)uVar169 >> 0x10);
            auVar178[1] = (0 < sVar13) * (sVar13 < 0x100) * cVar26 - (0xff < sVar13);
            auVar178[0] = (0 < sVar112) * (sVar112 < 0x100) * cVar25 - (0xff < sVar112);
            sVar13 = (short)((uint6)uVar170 >> 0x20);
            auVar178[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar27 - (0xff < sVar13);
            sVar13 = (short)((ulong)uVar171 >> 0x30);
            auVar178[3] = (0 < sVar13) * (sVar13 < 0x100) * cVar28 - (0xff < sVar13);
            sVar13 = (short)((unkuint10)auVar172._0_10_ >> 0x40);
            auVar178[4] = (0 < sVar13) * (sVar13 < 0x100) * cVar29 - (0xff < sVar13);
            sVar13 = auVar172._10_2_;
            auVar178[5] = (0 < sVar13) * (sVar13 < 0x100) * cVar30 - (0xff < sVar13);
            sVar13 = auVar173._12_2_;
            auVar178[6] = (0 < sVar13) * (sVar13 < 0x100) * cVar31 - (0xff < sVar13);
            sVar13 = auVar177._14_2_;
            auVar178[7] = (0 < sVar13) * (sVar13 < 0x100) * cVar32 - (0xff < sVar13);
            auVar178[8] = (0 < sVar54) * (sVar54 < 0x100) * cVar19 - (0xff < sVar54);
            sVar13 = (short)((uint)uVar151 >> 0x10);
            auVar178[9] = (0 < sVar13) * (sVar13 < 0x100) * cVar110 - (0xff < sVar13);
            sVar13 = (short)((uint6)uVar152 >> 0x20);
            auVar178[10] = (0 < sVar13) * (sVar13 < 0x100) * cVar20 - (0xff < sVar13);
            sVar13 = (short)((ulong)uVar153 >> 0x30);
            auVar178[0xb] = (0 < sVar13) * (sVar13 < 0x100) * cVar21 - (0xff < sVar13);
            sVar13 = (short)((unkuint10)auVar154._0_10_ >> 0x40);
            auVar178[0xc] = (0 < sVar13) * (sVar13 < 0x100) * cVar22 - (0xff < sVar13);
            sVar13 = auVar154._10_2_;
            auVar178[0xd] = (0 < sVar13) * (sVar13 < 0x100) * cVar23 - (0xff < sVar13);
            sVar13 = auVar155._12_2_;
            auVar178[0xe] = (0 < sVar13) * (sVar13 < 0x100) * cVar24 - (0xff < sVar13);
            sVar13 = auVar157._14_2_;
            auVar178[0xf] = (0 < sVar13) * (sVar13 < 0x100) * cVar111 - (0xff < sVar13);
            *(undefined1 (*) [16])((long)&local_288[0].data + lVar93) = auVar178;
            lVar93 = lVar93 + 0x10;
            uVar61 = uVar61 + 0x10;
            uVar97 = uVar97 + 0x10;
            uVar81 = uVar81 + 0x10;
            uVar124 = uVar124 + 0x10;
            uVar125 = uVar125 + 0x10;
            uVar127 = uVar127 + 0x10;
            uVar128 = uVar128 + 0x10;
            uVar129 = uVar129 + 0x10;
            uVar130 = uVar130 + 0x10;
            uVar131 = uVar131 + 0x10;
            uVar132 = uVar132 + 0x10;
            uVar133 = uVar133 + 0x10;
            uVar134 = uVar134 + 0x10;
            uVar136 = uVar136 + 0x10;
            uVar137 = uVar137 + 0x10;
            uVar138 = uVar138 + 0x10;
          } while (lVar93 != 0x100);
          auVar118 = _DAT_001811f0;
          if (0 < psVar82[1].cff.cursor) {
            lVar73._0_4_ = psVar82[1].hmtx;
            lVar73._4_4_ = psVar82[1].kern;
            iVar62 = 0;
            do {
              if ((*(int *)(lVar73 + 0xc) != 0) && (*(ushort *)(lVar73 + 6) != 0)) {
                uVar53 = *(ushort *)(lVar73 + 4);
                iVar95 = atlas_00->TexWidth;
                puVar67 = atlas_00->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar73 + 10) * (long)iVar95 +
                          (ulong)*(ushort *)(lVar73 + 8);
                uVar61 = (uint)*(ushort *)(lVar73 + 6);
                do {
                  if ((ulong)uVar53 != 0) {
                    uVar64 = 0;
                    do {
                      puVar67[uVar64] =
                           *(uchar *)((long)&local_288[0].data + (ulong)puVar67[uVar64]);
                      uVar64 = uVar64 + 1;
                    } while (uVar53 != uVar64);
                  }
                  puVar67 = puVar67 + iVar95;
                  bVar99 = 1 < (int)uVar61;
                  uVar61 = uVar61 - 1;
                } while (bVar99);
              }
              iVar62 = iVar62 + 1;
              lVar73 = lVar73 + 0x10;
            } while (iVar62 < psVar82[1].cff.cursor);
          }
        }
        psVar82[1].hmtx = 0;
        psVar82[1].kern = 0;
        lVar93 = local_300;
        pIVar83 = atlas_00;
      }
      lVar93 = lVar93 + 1;
    } while (lVar93 < iVar14);
  }
  ImGui::MemFree(local_418);
  ImGui::MemFree(local_360);
  uVar153 = local_448._8_8_;
  if ((void *)local_448._8_8_ != (void *)0x0) {
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_448._8_8_;
    local_448 = auVar39 << 0x40;
    ImGui::MemFree((void *)uVar153);
    local_448._8_8_ = 0;
  }
  if (0 < iVar14) {
    lVar93 = 0;
    auVar108._0_12_ = DAT_0018df90._0_12_;
    auVar108._12_2_ = DAT_0018df90._6_2_;
    auVar108._14_2_ = DAT_0018df90._6_2_;
    auVar107._12_4_ = auVar108._12_4_;
    auVar107._0_10_ = (unkbyte10)DAT_0018df90;
    auVar107._10_2_ = DAT_0018df90._4_2_;
    auVar106._10_6_ = auVar107._10_6_;
    auVar106._0_8_ = (undefined8)DAT_0018df90;
    auVar106._8_2_ = DAT_0018df90._4_2_;
    local_458._8_8_ = auVar106._8_8_;
    local_458._6_2_ = DAT_0018df90._2_2_;
    local_458._4_2_ = DAT_0018df90._2_2_;
    local_458._0_2_ = (undefined2)DAT_0018df90;
    local_458._2_2_ = local_458._0_2_;
    do {
      auVar116 = local_478;
      lVar73 = lVar93 * 0x110;
      if (*(int *)((long)pvStack_490 + lVar73 + 0xe8) != 0) {
        pIVar17 = (pIVar83->ConfigData).Data;
        pIVar90 = pIVar17 + lVar93;
        pIVar15 = pIVar17[lVar93].DstFont;
        if (pIVar17[lVar93].MergeMode == false) {
          fVar115 = pIVar17[lVar93].SizePixels;
          lVar98 = *(long *)((long)pvStack_490 + lVar73 + 8);
          lVar79 = (long)*(int *)((long)pvStack_490 + lVar73 + 0x24);
          local_478._1_3_ = 0;
          local_478[0] = *(byte *)(lVar98 + 4 + lVar79);
          local_478._4_12_ = auVar116._4_12_;
          bVar101 = *(byte *)(lVar98 + 5 + lVar79);
          bVar109 = *(byte *)(lVar98 + 7 + lVar79);
          bVar11 = *(byte *)(lVar98 + 6 + lVar79);
          ImFont::ClearOutputData(pIVar15);
          iVar62 = (uint)bVar11 * 0x100 + local_478._0_4_;
          auVar34._1_9_ = (unkuint9)(byte)((uint)iVar62 >> 0x18) << 8;
          auVar34[0] = (char)((uint)iVar62 >> 0x10);
          auVar34._10_6_ = 0;
          auVar43._1_12_ = SUB1612(auVar34 << 0x28,4);
          auVar43[0] = (char)((uint)iVar62 >> 8);
          auVar43[0xd] = 0;
          auVar46._1_14_ = auVar43 << 8;
          auVar46[0] = (char)iVar62;
          auVar46[0xf] = 0;
          auVar116 = ZEXT416((uint)bVar101 | (uint)bVar109 << 0x10) | auVar46 << 8;
          sVar54 = auVar116._0_2_;
          sVar13 = auVar116._2_2_;
          auVar119._0_4_ = (float)((int)sVar54 - (int)sVar13);
          fVar115 = fVar115 / auVar119._0_4_;
          sVar114 = auVar116._6_2_;
          auVar122._0_14_ = ZEXT414((uint)auVar119._0_4_);
          auVar122._14_2_ = sVar114;
          sVar112 = auVar116._4_2_;
          auVar121._12_4_ = auVar122._12_4_;
          auVar121._4_6_ = 0;
          auVar121._0_4_ = auVar119._0_4_;
          auVar121._10_2_ = sVar112;
          auVar120._10_6_ = auVar121._10_6_;
          auVar120._4_6_ = 0;
          auVar120._0_4_ = auVar119._0_4_;
          auVar119._8_8_ = auVar120._8_8_;
          auVar119._6_2_ = sVar13;
          auVar119._4_2_ = (short)((uint)auVar119._0_4_ >> 0x10);
          auVar126._0_2_ = -(ushort)(sVar54 < (short)local_458._0_2_);
          auVar126._2_2_ = -(ushort)(sVar54 < (short)local_458._2_2_);
          auVar126._4_2_ = -(ushort)(sVar13 < (short)local_458._4_2_);
          auVar126._6_2_ = -(ushort)(sVar13 < (short)local_458._6_2_);
          auVar126._8_2_ = -(ushort)(sVar112 < (short)local_458._8_2_);
          auVar126._10_2_ = -(ushort)(sVar112 < (short)local_458._10_2_);
          auVar126._12_2_ = -(ushort)(sVar114 < (short)local_458._12_2_);
          auVar126._14_2_ = -(ushort)(sVar114 < (short)local_458._14_2_);
          auVar116 = auVar126 & _DAT_0018b820 | ~auVar126 & _DAT_00181310;
          pIVar15->FontSize = pIVar90->SizePixels;
          pIVar15->ConfigData = pIVar90;
          pIVar15->ConfigDataCount = 0;
          pIVar15->ContainerAtlas = pIVar83;
          pIVar15->Ascent = (float)(int)(fVar115 * (float)(int)sVar54 + auVar116._0_4_);
          pIVar15->Descent =
               (float)(int)(fVar115 * (float)(auVar119._4_4_ >> 0x10) + auVar116._4_4_);
        }
        pIVar15->ConfigDataCount = pIVar15->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvStack_490 + lVar73 + 0xe8)) {
          fVar115 = (pIVar90->GlyphOffset).x;
          local_478 = ZEXT416((uint)((float)(int)(pIVar15->Ascent + 0.5) + (pIVar90->GlyphOffset).y)
                             );
          lVar79 = 0;
          lVar98 = 0;
          do {
            lVar18 = *(long *)((long)pvStack_490 + lVar73 + 0xd0);
            fVar141 = 1.0 / (float)pIVar83->TexHeight;
            fVar102 = 1.0 / (float)pIVar83->TexWidth;
            ImFont::AddGlyph(pIVar15,pIVar90,
                             *(ImWchar *)
                              (*(long *)((long)pvStack_490 + lVar73 + 0x108) + lVar98 * 4),
                             *(float *)(lVar18 + 8 + lVar79) + 0.0 + fVar115,
                             *(float *)(lVar18 + 0xc + lVar79) + 0.0 + local_478._0_4_,
                             *(float *)(lVar18 + 0x14 + lVar79) + 0.0 + fVar115,
                             *(float *)(lVar18 + 0x18 + lVar79) + 0.0 + local_478._0_4_,
                             (float)*(ushort *)(lVar18 + lVar79) * fVar102,
                             (float)*(ushort *)(lVar18 + 2 + lVar79) * fVar141,
                             (float)*(ushort *)(lVar18 + 4 + lVar79) * fVar102,
                             (float)*(ushort *)(lVar18 + 6 + lVar79) * fVar141,
                             *(float *)(lVar18 + 0x10 + lVar79));
            lVar98 = lVar98 + 1;
            lVar79 = lVar79 + 0x1c;
          } while (lVar98 < *(int *)((long)pvStack_490 + lVar73 + 0xe8));
        }
      }
      lVar93 = lVar93 + 1;
    } while (lVar93 < iVar14);
  }
  if (0 < iVar14) {
    lVar93 = 0x108;
    lVar73 = 0;
    do {
      if (*(void **)((long)pvStack_490 + lVar93) != (void *)0x0) {
        ImGui::MemFree(*(void **)((long)pvStack_490 + lVar93));
      }
      pvVar63 = *(void **)((long)pvStack_490 + lVar93 + -0x10);
      if (pvVar63 != (void *)0x0) {
        ImGui::MemFree(pvVar63);
      }
      lVar73 = lVar73 + 1;
      lVar93 = lVar93 + 0x110;
    } while (lVar73 < iVar14);
  }
  ImFontAtlasBuildFinish(pIVar83);
  if (pvStack_420 != (void *)0x0) {
    ImGui::MemFree(pvStack_420);
  }
  if ((void *)local_448._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_448._8_8_);
  }
LAB_001421fb:
  bVar101 = (byte)((uint)iVar185 >> 0x18);
  if (pvStack_430 != (void *)0x0) {
    ImGui::MemFree(pvStack_430);
  }
  if (pvStack_490 != (void *)0x0) {
    ImGui::MemFree(pvStack_490);
  }
  return (bool)(bVar101 & 1);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}